

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Allocator *pAVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  int iVar23;
  Mat *pMVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  Option *pOVar29;
  int iVar30;
  undefined1 (*pauVar31) [64];
  float *pfVar32;
  Mat *c;
  undefined8 *puVar33;
  undefined1 (*pauVar34) [32];
  void *pvVar35;
  Mat *pMVar36;
  undefined1 (*pauVar37) [64];
  float *pfVar38;
  int iVar39;
  int iVar40;
  Mat *a;
  ulong uVar41;
  int y;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 (*pauVar45) [64];
  __m512 *pafVar46;
  __m512 *pafVar47;
  __m512 *pafVar48;
  undefined1 (*pauVar49) [32];
  undefined1 (*pauVar50) [32];
  long lVar51;
  void *pvVar52;
  uint uVar53;
  long lVar54;
  void *pvVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  __m512 afVar59;
  undefined8 uVar60;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  float in_register_0000125c;
  binary_op_pow op;
  __m512 _p1;
  __m512 _a0;
  __m512 *local_178;
  binary_op_pow local_169;
  Option *local_168;
  __m512 *local_160;
  undefined8 local_158;
  __m512 *local_150;
  ulong local_148;
  Mat *local_140;
  Mat *local_138;
  Mat *local_130;
  ulong local_128;
  uint local_11c;
  size_t local_118;
  int local_10c;
  size_t local_108;
  __m512 local_100;
  __m512 local_c0 [2];
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar24 = a + 1;
  c = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar22 = a->elempack;
  iVar23 = a[1].elempack;
  local_168 = opt;
  if (iVar23 != 0x10 && iVar22 != 0x10) {
switchD_003eeaf0_default:
    if (iVar23 != 8 && iVar22 != 8) {
switchD_003eebcf_default:
      if (iVar23 != 4 && iVar22 != 4) {
switchD_003eecbc_default:
        iVar22 = BinaryOp::forward((BinaryOp *)
                                   ((long)&this->_vptr_BinaryOp_x86_avx512 +
                                   (long)this->_vptr_BinaryOp_x86_avx512[-3]),bottom_blobs,top_blobs
                                   ,opt);
        return iVar22;
      }
      switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3])) {
      case 0:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>(a,pMVar24,c,opt);
        return iVar22;
      case 1:
        pMVar36 = pMVar24;
        break;
      case 2:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>(a,pMVar24,c,opt);
        return iVar22;
      case 3:
        pMVar36 = pMVar24;
        goto LAB_003ef38b;
      case 4:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>(a,pMVar24,c,opt);
        return iVar22;
      case 5:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>(a,pMVar24,c,opt);
        return iVar22;
      case 6:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>(a,pMVar24,c,opt);
        return iVar22;
      case 7:
        pMVar36 = a;
        a = pMVar24;
        break;
      case 8:
        pMVar36 = a;
        a = pMVar24;
LAB_003ef38b:
        iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar36,c,opt);
        return iVar22;
      default:
        goto switchD_003eecbc_default;
      }
      iVar22 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar36,c,opt);
      return iVar22;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3])) {
    case 0:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      uVar53 = a->w;
      uVar43 = a->h;
      iVar30 = a->d;
      uVar42 = a->c;
      uVar25 = (ulong)uVar42;
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
      sVar26 = a->elemsize;
      uVar44 = a[1].w;
      uVar3 = a[1].h;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      uVar27 = (ulong)uVar4;
      iVar39 = uVar3 * uVar44 * iVar40;
      sVar5 = a[1].elemsize;
      local_158 = sVar26;
      switch(a->dims) {
      case 1:
        local_138 = pMVar24;
        if (iVar22 == 1 && uVar53 == 1) {
LAB_003eec76:
          local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
          iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                             (a,pMVar24,c,opt);
          return iVar22;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((uint)local_160 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                      (a,pMVar24,c,local_168);
            return 0;
          }
          goto LAB_003fa2b9;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pfVar32 = (float *)c->data;
          if (pfVar32 != (float *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar3) {
              pauVar34 = (undefined1 (*) [32])a->data;
              pfVar38 = (float *)a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar56 = *pauVar34;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar38[1];
                    fVar16 = pfVar38[2];
                    fVar17 = pfVar38[3];
                    fVar18 = pfVar38[4];
                    fVar19 = pfVar38[5];
                    fVar20 = pfVar38[6];
                    fVar21 = pfVar38[7];
                    *pfVar32 = auVar56._0_4_ + *pfVar38;
                    pfVar32[1] = auVar56._4_4_ + fVar2;
                    pfVar32[2] = auVar56._8_4_ + fVar16;
                    pfVar32[3] = auVar56._12_4_ + fVar17;
                    pfVar32[4] = auVar56._16_4_ + fVar18;
                    pfVar32[5] = auVar56._20_4_ + fVar19;
                    pfVar32[6] = auVar56._24_4_ + fVar20;
                    pfVar32[7] = auVar56._28_4_ + fVar21;
                    pfVar38 = pfVar38 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data != (void *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data != (void *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          break;
        default:
LAB_003fd127:
          return 0;
        }
        return -100;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar3) {
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(a[1].cstep * uVar25 * a[1].elemsize + (long)a[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)a->w * uVar25 * a->elemsize + (long)a->data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *pauVar34;
                      uVar43 = uVar44;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        fVar21 = pfVar38[7];
                        *pfVar32 = auVar56._0_4_ + *pfVar38;
                        pfVar32[1] = auVar56._4_4_ + fVar2;
                        pfVar32[2] = auVar56._8_4_ + fVar16;
                        pfVar32[3] = auVar56._12_4_ + fVar17;
                        pfVar32[4] = auVar56._16_4_ + fVar18;
                        pfVar32[5] = auVar56._20_4_ + fVar19;
                        pfVar32[6] = auVar56._24_4_ + fVar20;
                        pfVar32[7] = auVar56._28_4_ + fVar21;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar40) {
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(local_140[1].cstep * uVar25 * local_140[1].elemsize +
                                     (long)local_140[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)local_140->w * uVar25 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      auVar56 = *pauVar34;
                      uVar53 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            fVar2 = pfVar38[1];
                            fVar16 = pfVar38[2];
                            fVar17 = pfVar38[3];
                            fVar18 = pfVar38[4];
                            fVar19 = pfVar38[5];
                            fVar20 = pfVar38[6];
                            fVar21 = pfVar38[7];
                            *pfVar32 = auVar56._0_4_ + *pfVar38;
                            pfVar32[1] = auVar56._4_4_ + fVar2;
                            pfVar32[2] = auVar56._8_4_ + fVar16;
                            pfVar32[3] = auVar56._12_4_ + fVar17;
                            pfVar32[4] = auVar56._16_4_ + fVar18;
                            pfVar32[5] = auVar56._20_4_ + fVar19;
                            pfVar32[6] = auVar56._24_4_ + fVar20;
                            pfVar32[7] = auVar56._28_4_ + fVar21;
                            pfVar38 = pfVar38 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar23 = local_140[1].dims;
        if (iVar23 == 1) {
          Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
          pfVar32 = (float *)c->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar43) {
              pfVar38 = (float *)local_140->data;
              pauVar34 = (undefined1 (*) [32])local_140[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar53) {
                  auVar56 = *pauVar34;
                  uVar44 = uVar53;
                  do {
                    fVar2 = pfVar38[1];
                    fVar16 = pfVar38[2];
                    fVar17 = pfVar38[3];
                    fVar18 = pfVar38[4];
                    fVar19 = pfVar38[5];
                    fVar20 = pfVar38[6];
                    fVar21 = pfVar38[7];
                    *pfVar32 = auVar56._0_4_ + *pfVar38;
                    pfVar32[1] = auVar56._4_4_ + fVar2;
                    pfVar32[2] = auVar56._8_4_ + fVar16;
                    pfVar32[3] = auVar56._12_4_ + fVar17;
                    pfVar32[4] = auVar56._16_4_ + fVar18;
                    pfVar32[5] = auVar56._20_4_ + fVar19;
                    pfVar32[6] = auVar56._24_4_ + fVar20;
                    pfVar32[7] = auVar56._28_4_ + fVar21;
                    pfVar38 = pfVar38 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
LAB_003fa2b9:
          iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                             (a,pMVar24,c,local_168);
          return iVar22;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_140 = a;
            local_138 = pMVar24;
            Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if (0 < (int)uVar4) {
                uVar25 = 0;
                do {
                  if (0 < iVar40) {
                    pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                    pfVar38 = (float *)(local_140[1].cstep * uVar25 * local_140[1].elemsize +
                                       (long)local_140[1].data);
                    pauVar34 = (undefined1 (*) [32])
                               (local_140->cstep * uVar25 * local_140->elemsize +
                               (long)local_140->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar56 = *pauVar34;
                            uVar43 = uVar44;
                            do {
                              fVar2 = pfVar38[1];
                              fVar16 = pfVar38[2];
                              fVar17 = pfVar38[3];
                              fVar18 = pfVar38[4];
                              fVar19 = pfVar38[5];
                              fVar20 = pfVar38[6];
                              fVar21 = pfVar38[7];
                              *pfVar32 = auVar56._0_4_ + *pfVar38;
                              pfVar32[1] = auVar56._4_4_ + fVar2;
                              pfVar32[2] = auVar56._8_4_ + fVar16;
                              pfVar32[3] = auVar56._12_4_ + fVar17;
                              pfVar32[4] = auVar56._16_4_ + fVar18;
                              pfVar32[5] = auVar56._20_4_ + fVar19;
                              pfVar32[6] = auVar56._24_4_ + fVar20;
                              pfVar32[7] = auVar56._28_4_ + fVar21;
                              pfVar38 = pfVar38 + 8;
                              pfVar32 = pfVar32 + 8;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar53 = uVar53 + 1;
                        } while (uVar53 != uVar3);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar40);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar27);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims != 1) {
            if (local_140[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  pfVar32 = (float *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)local_140[1].w * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pfVar38 = (float *)(local_140->cstep * uVar27 * local_140->elemsize +
                                     (long)local_140->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *pauVar34;
                      uVar44 = uVar53;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        fVar21 = pfVar38[7];
                        *pfVar32 = auVar56._0_4_ + *pfVar38;
                        pfVar32[1] = auVar56._4_4_ + fVar2;
                        pfVar32[2] = auVar56._8_4_ + fVar16;
                        pfVar32[3] = auVar56._12_4_ + fVar17;
                        pfVar32[4] = auVar56._16_4_ + fVar18;
                        pfVar32[5] = auVar56._20_4_ + fVar19;
                        pfVar32[6] = auVar56._24_4_ + fVar20;
                        pfVar32[7] = auVar56._28_4_ + fVar21;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)pMVar24->data + uVar27 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140->cstep;
                  sVar8 = local_140->elemsize;
                  pvVar35 = local_140->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa2b9;
        }
        if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])
                             ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                  pvVar52 = c->data;
                  sVar7 = a->cstep;
                  sVar8 = a->elemsize;
                  pvVar35 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  sVar7 = a->cstep;
                  pvVar52 = c->data;
                  pvVar35 = a[1].data;
                  sVar8 = a->elemsize;
                  pvVar55 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    fVar2 = *(float *)((long)pvVar35 + lVar28);
                    pfVar32 = (float *)((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar27);
                    auVar61._0_4_ = fVar2 + *pfVar32;
                    auVar61._4_4_ = fVar2 + pfVar32[1];
                    auVar61._8_4_ = fVar2 + pfVar32[2];
                    auVar61._12_4_ = fVar2 + pfVar32[3];
                    auVar61._16_4_ = fVar2 + pfVar32[4];
                    auVar61._20_4_ = fVar2 + pfVar32[5];
                    auVar61._24_4_ = fVar2 + pfVar32[6];
                    auVar61._28_4_ = fVar2 + pfVar32[7];
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 * 8 + sVar26 * sVar5 * uVar27) =
                         auVar61;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_150 = (__m512 *)sVar5;
        if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar25 * a->elemsize);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar44 == uVar53) && (iVar22 == 1)) && ((uVar3 == uVar43 && (uVar42 == 1)))) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  pvVar52 = a->data;
                  pvVar35 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    fVar2 = *(float *)((long)pvVar52 + lVar28);
                    pfVar32 = (float *)((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar25);
                    auVar63._0_4_ = fVar2 + *pfVar32;
                    auVar63._4_4_ = fVar2 + pfVar32[1];
                    auVar63._8_4_ = fVar2 + pfVar32[2];
                    auVar63._12_4_ = fVar2 + pfVar32[3];
                    auVar63._16_4_ = fVar2 + pfVar32[4];
                    auVar63._20_4_ = fVar2 + pfVar32[5];
                    auVar63._24_4_ = fVar2 + pfVar32[6];
                    auVar63._28_4_ = fVar2 + pfVar32[7];
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 * 8 + sVar26 * sVar5 * uVar25) =
                         auVar63;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = a[1].cstep;
                  sVar5 = a[1].elemsize;
                  pvVar52 = a[1].data;
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(a->cstep * uVar25 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar41 * 0x20 + sVar26 * uVar25 * sVar5);
                      uVar42 = uVar53;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        fVar21 = pfVar38[7];
                        *pfVar32 = auVar56._0_4_ + *pfVar38;
                        pfVar32[1] = auVar56._4_4_ + fVar2;
                        pfVar32[2] = auVar56._8_4_ + fVar16;
                        pfVar32[3] = auVar56._12_4_ + fVar17;
                        pfVar32[4] = auVar56._16_4_ + fVar18;
                        pfVar32[5] = auVar56._20_4_ + fVar19;
                        pfVar32[6] = auVar56._24_4_ + fVar20;
                        pfVar32[7] = auVar56._28_4_ + fVar21;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_148 = uVar27;
        if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = local_140[1].elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140->cstep * uVar27 * local_140->elemsize +
                                    (long)local_140->data);
                  sVar5 = local_140[1].cstep;
                  pvVar52 = local_140[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      lVar28 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                        pfVar38 = (float *)((long)pvVar55 + lVar28);
                        auVar65._0_4_ = *pfVar32 + *pfVar38;
                        auVar65._4_4_ = pfVar32[1] + pfVar38[1];
                        auVar65._8_4_ = pfVar32[2] + pfVar38[2];
                        auVar65._12_4_ = pfVar32[3] + pfVar38[3];
                        auVar65._16_4_ = pfVar32[4] + pfVar38[4];
                        auVar65._20_4_ = pfVar32[5] + pfVar38[5];
                        auVar65._24_4_ = pfVar32[6] + pfVar38[6];
                        auVar65._28_4_ = pfVar32[7] + pfVar38[7];
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar65;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar53 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->cstep;
                  sVar5 = local_140->elemsize;
                  pvVar52 = local_140->data;
                  pfVar32 = (float *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                     (long)local_140[1].data);
                  uVar25 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar25 * 0x20 + sVar26 * uVar27 * sVar5);
                      uVar53 = uVar44;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        fVar21 = pfVar38[7];
                        *pfVar32 = auVar56._0_4_ + *pfVar38;
                        pfVar32[1] = auVar56._4_4_ + fVar2;
                        pfVar32[2] = auVar56._8_4_ + fVar16;
                        pfVar32[3] = auVar56._12_4_ + fVar17;
                        pfVar32[4] = auVar56._16_4_ + fVar18;
                        pfVar32[5] = auVar56._20_4_ + fVar19;
                        pfVar32[6] = auVar56._24_4_ + fVar20;
                        pfVar32[7] = auVar56._28_4_ + fVar21;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar53 = uVar53 - 1;
                      } while (uVar53 != 0);
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_138 = pMVar24;
        local_130 = c;
        if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                    (long)local_140[1].data);
                  sVar5 = local_140->cstep;
                  pvVar52 = local_140->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar28 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar55 + lVar28);
                        pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                        auVar66._0_4_ = *pfVar32 + *pfVar38;
                        auVar66._4_4_ = pfVar32[1] + pfVar38[1];
                        auVar66._8_4_ = pfVar32[2] + pfVar38[2];
                        auVar66._12_4_ = pfVar32[3] + pfVar38[3];
                        auVar66._16_4_ = pfVar32[4] + pfVar38[4];
                        auVar66._20_4_ = pfVar32[5] + pfVar38[5];
                        auVar66._24_4_ = pfVar32[6] + pfVar38[6];
                        auVar66._28_4_ = pfVar32[7] + pfVar38[7];
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar66;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar44 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003fd1ae;
      case 4:
        local_138 = pMVar24;
        if (a[1].dims != 4) {
          local_148 = uVar25;
          Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          iVar22 = a[1].dims;
          if (iVar22 != 1) {
            if (iVar22 == 3) {
              if (0 < (int)local_148) {
                sVar26 = 0;
                do {
                  if (0 < iVar30) {
                    pfVar32 = (float *)(c->cstep * sVar26 * c->elemsize + (long)c->data);
                    pauVar34 = (undefined1 (*) [32])
                               (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                    pfVar38 = (float *)(a->cstep * sVar26 * a->elemsize + (long)a->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar53) {
                            auVar56 = *pauVar34;
                            uVar44 = uVar53;
                            do {
                              fVar2 = pfVar38[1];
                              fVar16 = pfVar38[2];
                              fVar17 = pfVar38[3];
                              fVar18 = pfVar38[4];
                              fVar19 = pfVar38[5];
                              fVar20 = pfVar38[6];
                              fVar21 = pfVar38[7];
                              *pfVar32 = auVar56._0_4_ + *pfVar38;
                              pfVar32[1] = auVar56._4_4_ + fVar2;
                              pfVar32[2] = auVar56._8_4_ + fVar16;
                              pfVar32[3] = auVar56._12_4_ + fVar17;
                              pfVar32[4] = auVar56._16_4_ + fVar18;
                              pfVar32[5] = auVar56._20_4_ + fVar19;
                              pfVar32[6] = auVar56._24_4_ + fVar20;
                              pfVar32[7] = auVar56._28_4_ + fVar21;
                              pfVar38 = pfVar38 + 8;
                              pfVar32 = pfVar32 + 8;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar30);
                  }
                  sVar26 = sVar26 + 1;
                } while (sVar26 != local_148);
                return 0;
              }
              return 0;
            }
            if (iVar22 != 2) {
              return 0;
            }
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pfVar32 = (float *)(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                  pfVar38 = (float *)(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar56 = *pauVar34;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar53;
                        if (0 < (int)uVar53) {
                          do {
                            fVar2 = pfVar38[1];
                            fVar16 = pfVar38[2];
                            fVar17 = pfVar38[3];
                            fVar18 = pfVar38[4];
                            fVar19 = pfVar38[5];
                            fVar20 = pfVar38[6];
                            fVar21 = pfVar38[7];
                            *pfVar32 = auVar56._0_4_ + *pfVar38;
                            pfVar32[1] = auVar56._4_4_ + fVar2;
                            pfVar32[2] = auVar56._8_4_ + fVar16;
                            pfVar32[3] = auVar56._12_4_ + fVar17;
                            pfVar32[4] = auVar56._16_4_ + fVar18;
                            pfVar32[5] = auVar56._20_4_ + fVar19;
                            pfVar32[6] = auVar56._24_4_ + fVar20;
                            pfVar32[7] = auVar56._28_4_ + fVar21;
                            pfVar38 = pfVar38 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          pMVar24 = local_138;
          if ((uint)local_160 != 1 || a[1].w != 1) {
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_138->data + sVar26 * 0x20);
                  pvVar52 = a->data;
                  sVar8 = c->cstep;
                  sVar9 = c->elemsize;
                  pvVar35 = c->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar38 = (float *)((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26);
                    *pfVar38 = auVar56._0_4_ + *pfVar32;
                    pfVar38[1] = auVar56._4_4_ + fVar2;
                    pfVar38[2] = auVar56._8_4_ + fVar16;
                    pfVar38[3] = auVar56._12_4_ + fVar17;
                    pfVar38[4] = auVar56._16_4_ + fVar18;
                    pfVar38[5] = auVar56._20_4_ + fVar19;
                    pfVar38[6] = auVar56._24_4_ + fVar20;
                    pfVar38[7] = auVar56._28_4_ + fVar21;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa2b9;
        }
        goto LAB_003f0701;
      }
      goto LAB_003f464b;
    case 1:
      pMVar36 = pMVar24;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      uVar53 = a->w;
      uVar43 = a->h;
      iVar30 = a->d;
      uVar42 = a->c;
      uVar25 = (ulong)uVar42;
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
      sVar26 = a->elemsize;
      uVar44 = a[1].w;
      uVar3 = a[1].h;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      uVar27 = (ulong)uVar4;
      iVar39 = uVar3 * uVar44 * iVar40;
      sVar5 = a[1].elemsize;
      local_158 = sVar26;
      switch(a->dims) {
      case 1:
        local_138 = pMVar24;
        if (iVar22 == 1 && uVar53 == 1) {
LAB_003ef130:
          local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
          iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                             (a,pMVar24,c,opt);
          return iVar22;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((uint)local_160 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                      (a,pMVar24,c,local_168);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pfVar32 = (float *)c->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar34 = (undefined1 (*) [32])a->data;
              pfVar38 = (float *)a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar56 = *pauVar34;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar38[1];
                    fVar16 = pfVar38[2];
                    fVar17 = pfVar38[3];
                    fVar18 = pfVar38[4];
                    fVar19 = pfVar38[5];
                    fVar20 = pfVar38[6];
                    *pfVar32 = auVar56._0_4_ * *pfVar38;
                    pfVar32[1] = auVar56._4_4_ * fVar2;
                    pfVar32[2] = auVar56._8_4_ * fVar16;
                    pfVar32[3] = auVar56._12_4_ * fVar17;
                    pfVar32[4] = auVar56._16_4_ * fVar18;
                    pfVar32[5] = auVar56._20_4_ * fVar19;
                    pfVar32[6] = auVar56._24_4_ * fVar20;
                    pfVar32[7] = in_register_0000125c;
                    pfVar38 = pfVar38 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          goto LAB_003fd127;
        }
LAB_003fa1b3:
        iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                           (a,pMVar24,c,local_168);
        return iVar22;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar3) {
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(a[1].cstep * uVar25 * a[1].elemsize + (long)a[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)a->w * uVar25 * a->elemsize + (long)a->data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *pauVar34;
                      uVar43 = uVar44;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        *pfVar32 = auVar56._0_4_ * *pfVar38;
                        pfVar32[1] = auVar56._4_4_ * fVar2;
                        pfVar32[2] = auVar56._8_4_ * fVar16;
                        pfVar32[3] = auVar56._12_4_ * fVar17;
                        pfVar32[4] = auVar56._16_4_ * fVar18;
                        pfVar32[5] = auVar56._20_4_ * fVar19;
                        pfVar32[6] = auVar56._24_4_ * fVar20;
                        pfVar32[7] = in_register_0000125c;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar40) {
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(local_140[1].cstep * uVar25 * local_140[1].elemsize +
                                     (long)local_140[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)local_140->w * uVar25 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      auVar56 = *pauVar34;
                      uVar53 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            fVar2 = pfVar38[1];
                            fVar16 = pfVar38[2];
                            fVar17 = pfVar38[3];
                            fVar18 = pfVar38[4];
                            fVar19 = pfVar38[5];
                            fVar20 = pfVar38[6];
                            *pfVar32 = auVar56._0_4_ * *pfVar38;
                            pfVar32[1] = auVar56._4_4_ * fVar2;
                            pfVar32[2] = auVar56._8_4_ * fVar16;
                            pfVar32[3] = auVar56._12_4_ * fVar17;
                            pfVar32[4] = auVar56._16_4_ * fVar18;
                            pfVar32[5] = auVar56._20_4_ * fVar19;
                            pfVar32[6] = auVar56._24_4_ * fVar20;
                            pfVar32[7] = in_register_0000125c;
                            pfVar38 = pfVar38 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar23 = local_140[1].dims;
        if (iVar23 == 1) {
          Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
          pfVar32 = (float *)c->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar43) {
              pfVar38 = (float *)local_140->data;
              pauVar34 = (undefined1 (*) [32])local_140[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar53) {
                  auVar56 = *pauVar34;
                  uVar44 = uVar53;
                  do {
                    fVar2 = pfVar38[1];
                    fVar16 = pfVar38[2];
                    fVar17 = pfVar38[3];
                    fVar18 = pfVar38[4];
                    fVar19 = pfVar38[5];
                    fVar20 = pfVar38[6];
                    *pfVar32 = auVar56._0_4_ * *pfVar38;
                    pfVar32[1] = auVar56._4_4_ * fVar2;
                    pfVar32[2] = auVar56._8_4_ * fVar16;
                    pfVar32[3] = auVar56._12_4_ * fVar17;
                    pfVar32[4] = auVar56._16_4_ * fVar18;
                    pfVar32[5] = auVar56._20_4_ * fVar19;
                    pfVar32[6] = auVar56._24_4_ * fVar20;
                    pfVar32[7] = in_register_0000125c;
                    pfVar38 = pfVar38 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa1b3;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_140 = a;
            local_138 = pMVar24;
            Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if (0 < (int)uVar4) {
                uVar25 = 0;
                do {
                  if (0 < iVar40) {
                    pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                    pfVar38 = (float *)(local_140[1].cstep * uVar25 * local_140[1].elemsize +
                                       (long)local_140[1].data);
                    pauVar34 = (undefined1 (*) [32])
                               (local_140->cstep * uVar25 * local_140->elemsize +
                               (long)local_140->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar56 = *pauVar34;
                            uVar43 = uVar44;
                            do {
                              fVar2 = pfVar38[1];
                              fVar16 = pfVar38[2];
                              fVar17 = pfVar38[3];
                              fVar18 = pfVar38[4];
                              fVar19 = pfVar38[5];
                              fVar20 = pfVar38[6];
                              *pfVar32 = auVar56._0_4_ * *pfVar38;
                              pfVar32[1] = auVar56._4_4_ * fVar2;
                              pfVar32[2] = auVar56._8_4_ * fVar16;
                              pfVar32[3] = auVar56._12_4_ * fVar17;
                              pfVar32[4] = auVar56._16_4_ * fVar18;
                              pfVar32[5] = auVar56._20_4_ * fVar19;
                              pfVar32[6] = auVar56._24_4_ * fVar20;
                              pfVar32[7] = in_register_0000125c;
                              pfVar38 = pfVar38 + 8;
                              pfVar32 = pfVar32 + 8;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar53 = uVar53 + 1;
                        } while (uVar53 != uVar3);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar40);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar27);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims != 1) {
            if (local_140[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  pfVar32 = (float *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)local_140[1].w * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pfVar38 = (float *)(local_140->cstep * uVar27 * local_140->elemsize +
                                     (long)local_140->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *pauVar34;
                      uVar44 = uVar53;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        *pfVar32 = auVar56._0_4_ * *pfVar38;
                        pfVar32[1] = auVar56._4_4_ * fVar2;
                        pfVar32[2] = auVar56._8_4_ * fVar16;
                        pfVar32[3] = auVar56._12_4_ * fVar17;
                        pfVar32[4] = auVar56._16_4_ * fVar18;
                        pfVar32[5] = auVar56._20_4_ * fVar19;
                        pfVar32[6] = auVar56._24_4_ * fVar20;
                        pfVar32[7] = in_register_0000125c;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)pMVar24->data + uVar27 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140->cstep;
                  sVar8 = local_140->elemsize;
                  pvVar35 = local_140->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa1b3;
        }
        if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])
                             ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                  pvVar52 = c->data;
                  sVar7 = a->cstep;
                  sVar8 = a->elemsize;
                  pvVar35 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  sVar7 = a->cstep;
                  pvVar52 = c->data;
                  pvVar35 = a[1].data;
                  sVar8 = a->elemsize;
                  pvVar55 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    fVar2 = *(float *)((long)pvVar35 + lVar28);
                    pfVar32 = (float *)((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar27);
                    auVar12._4_4_ = fVar2 * pfVar32[1];
                    auVar12._0_4_ = fVar2 * *pfVar32;
                    auVar12._8_4_ = fVar2 * pfVar32[2];
                    auVar12._12_4_ = fVar2 * pfVar32[3];
                    auVar12._16_4_ = fVar2 * pfVar32[4];
                    auVar12._20_4_ = fVar2 * pfVar32[5];
                    auVar12._24_4_ = fVar2 * pfVar32[6];
                    auVar12._28_4_ = fVar2;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 * 8 + sVar26 * sVar5 * uVar27) =
                         auVar12;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_150 = (__m512 *)sVar5;
        if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar25 * a->elemsize);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 == uVar53) && (iVar22 == 1)) && (uVar3 == uVar43)) && (uVar42 == 1)) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  pvVar52 = a->data;
                  pvVar35 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    fVar2 = *(float *)((long)pvVar52 + lVar28);
                    pfVar32 = (float *)((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar25);
                    auVar13._4_4_ = fVar2 * pfVar32[1];
                    auVar13._0_4_ = fVar2 * *pfVar32;
                    auVar13._8_4_ = fVar2 * pfVar32[2];
                    auVar13._12_4_ = fVar2 * pfVar32[3];
                    auVar13._16_4_ = fVar2 * pfVar32[4];
                    auVar13._20_4_ = fVar2 * pfVar32[5];
                    auVar13._24_4_ = fVar2 * pfVar32[6];
                    auVar13._28_4_ = fVar2;
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 * 8 + sVar26 * sVar5 * uVar25) =
                         auVar13;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = a[1].cstep;
                  sVar5 = a[1].elemsize;
                  pvVar52 = a[1].data;
                  pfVar32 = (float *)(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(a->cstep * uVar25 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar41 * 0x20 + sVar26 * uVar25 * sVar5);
                      uVar42 = uVar53;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        *pfVar32 = auVar56._0_4_ * *pfVar38;
                        pfVar32[1] = auVar56._4_4_ * fVar2;
                        pfVar32[2] = auVar56._8_4_ * fVar16;
                        pfVar32[3] = auVar56._12_4_ * fVar17;
                        pfVar32[4] = auVar56._16_4_ * fVar18;
                        pfVar32[5] = auVar56._20_4_ * fVar19;
                        pfVar32[6] = auVar56._24_4_ * fVar20;
                        pfVar32[7] = in_register_0000125c;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_148 = uVar27;
        if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = local_140[1].elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140->cstep * uVar27 * local_140->elemsize +
                                    (long)local_140->data);
                  sVar5 = local_140[1].cstep;
                  pvVar52 = local_140[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      lVar28 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                        pfVar38 = (float *)((long)pvVar55 + lVar28);
                        auVar14._4_4_ = pfVar32[1] * pfVar38[1];
                        auVar14._0_4_ = *pfVar32 * *pfVar38;
                        auVar14._8_4_ = pfVar32[2] * pfVar38[2];
                        auVar14._12_4_ = pfVar32[3] * pfVar38[3];
                        auVar14._16_4_ = pfVar32[4] * pfVar38[4];
                        auVar14._20_4_ = pfVar32[5] * pfVar38[5];
                        auVar14._24_4_ = pfVar32[6] * pfVar38[6];
                        auVar14._28_4_ = pfVar32[7];
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar14;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar53 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->cstep;
                  sVar5 = local_140->elemsize;
                  pvVar52 = local_140->data;
                  pfVar32 = (float *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pfVar38 = (float *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                     (long)local_140[1].data);
                  uVar25 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar25 * 0x20 + sVar26 * uVar27 * sVar5);
                      uVar53 = uVar44;
                      do {
                        fVar2 = pfVar38[1];
                        fVar16 = pfVar38[2];
                        fVar17 = pfVar38[3];
                        fVar18 = pfVar38[4];
                        fVar19 = pfVar38[5];
                        fVar20 = pfVar38[6];
                        *pfVar32 = auVar56._0_4_ * *pfVar38;
                        pfVar32[1] = auVar56._4_4_ * fVar2;
                        pfVar32[2] = auVar56._8_4_ * fVar16;
                        pfVar32[3] = auVar56._12_4_ * fVar17;
                        pfVar32[4] = auVar56._16_4_ * fVar18;
                        pfVar32[5] = auVar56._20_4_ * fVar19;
                        pfVar32[6] = auVar56._24_4_ * fVar20;
                        pfVar32[7] = in_register_0000125c;
                        pfVar38 = pfVar38 + 8;
                        pfVar32 = pfVar32 + 8;
                        uVar53 = uVar53 - 1;
                      } while (uVar53 != 0);
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_138 = pMVar24;
        local_130 = c;
        if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                    (long)local_140[1].data);
                  sVar5 = local_140->cstep;
                  pvVar52 = local_140->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar28 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar55 + lVar28);
                        pfVar38 = (float *)((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27);
                        auVar15._4_4_ = pfVar32[1] * pfVar38[1];
                        auVar15._0_4_ = *pfVar32 * *pfVar38;
                        auVar15._8_4_ = pfVar32[2] * pfVar38[2];
                        auVar15._12_4_ = pfVar32[3] * pfVar38[3];
                        auVar15._16_4_ = pfVar32[4] * pfVar38[4];
                        auVar15._20_4_ = pfVar32[5] * pfVar38[5];
                        auVar15._24_4_ = pfVar32[6] * pfVar38[6];
                        auVar15._28_4_ = pfVar32[7];
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar15;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar44 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003fd19b;
      case 4:
        local_138 = pMVar24;
        if (a[1].dims != 4) {
          local_148 = uVar25;
          Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          iVar22 = a[1].dims;
          if (iVar22 != 1) {
            if (iVar22 == 3) {
              if (0 < (int)local_148) {
                sVar26 = 0;
                do {
                  if (0 < iVar30) {
                    pfVar32 = (float *)(c->cstep * sVar26 * c->elemsize + (long)c->data);
                    pauVar34 = (undefined1 (*) [32])
                               (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                    pfVar38 = (float *)(a->cstep * sVar26 * a->elemsize + (long)a->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar53) {
                            auVar56 = *pauVar34;
                            uVar44 = uVar53;
                            do {
                              fVar2 = pfVar38[1];
                              fVar16 = pfVar38[2];
                              fVar17 = pfVar38[3];
                              fVar18 = pfVar38[4];
                              fVar19 = pfVar38[5];
                              fVar20 = pfVar38[6];
                              *pfVar32 = auVar56._0_4_ * *pfVar38;
                              pfVar32[1] = auVar56._4_4_ * fVar2;
                              pfVar32[2] = auVar56._8_4_ * fVar16;
                              pfVar32[3] = auVar56._12_4_ * fVar17;
                              pfVar32[4] = auVar56._16_4_ * fVar18;
                              pfVar32[5] = auVar56._20_4_ * fVar19;
                              pfVar32[6] = auVar56._24_4_ * fVar20;
                              pfVar32[7] = in_register_0000125c;
                              pfVar38 = pfVar38 + 8;
                              pfVar32 = pfVar32 + 8;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar30);
                  }
                  sVar26 = sVar26 + 1;
                } while (sVar26 != local_148);
                return 0;
              }
              return 0;
            }
            if (iVar22 != 2) {
              return 0;
            }
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pfVar32 = (float *)(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                  pfVar38 = (float *)(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar56 = *pauVar34;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar53;
                        if (0 < (int)uVar53) {
                          do {
                            fVar2 = pfVar38[1];
                            fVar16 = pfVar38[2];
                            fVar17 = pfVar38[3];
                            fVar18 = pfVar38[4];
                            fVar19 = pfVar38[5];
                            fVar20 = pfVar38[6];
                            *pfVar32 = auVar56._0_4_ * *pfVar38;
                            pfVar32[1] = auVar56._4_4_ * fVar2;
                            pfVar32[2] = auVar56._8_4_ * fVar16;
                            pfVar32[3] = auVar56._12_4_ * fVar17;
                            pfVar32[4] = auVar56._16_4_ * fVar18;
                            pfVar32[5] = auVar56._20_4_ * fVar19;
                            pfVar32[6] = auVar56._24_4_ * fVar20;
                            pfVar32[7] = in_register_0000125c;
                            pfVar38 = pfVar38 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          pMVar24 = local_138;
          if ((uint)local_160 != 1 || a[1].w != 1) {
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_138->data + sVar26 * 0x20);
                  pvVar52 = a->data;
                  sVar8 = c->cstep;
                  sVar9 = c->elemsize;
                  pvVar35 = c->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    pfVar32 = (float *)((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar38 = (float *)((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26);
                    *pfVar38 = auVar56._0_4_ * *pfVar32;
                    pfVar38[1] = auVar56._4_4_ * fVar2;
                    pfVar38[2] = auVar56._8_4_ * fVar16;
                    pfVar38[3] = auVar56._12_4_ * fVar17;
                    pfVar38[4] = auVar56._16_4_ * fVar18;
                    pfVar38[5] = auVar56._20_4_ * fVar19;
                    pfVar38[6] = auVar56._24_4_ * fVar20;
                    pfVar38[7] = in_register_0000125c;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa1b3;
        }
        goto LAB_003f0493;
      }
      goto LAB_003f44c0;
    case 3:
      pMVar36 = pMVar24;
      goto LAB_003ef2f7;
    case 4:
      if (3 < a->dims - 1U) {
LAB_003fd127:
        return 0;
      }
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      uVar53 = a->w;
      uVar43 = a->h;
      iVar30 = a->d;
      uVar42 = a->c;
      uVar25 = (ulong)uVar42;
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
      sVar26 = a->elemsize;
      uVar44 = a[1].w;
      uVar3 = a[1].h;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      uVar27 = (ulong)uVar4;
      iVar39 = uVar3 * uVar44 * iVar40;
      sVar5 = a[1].elemsize;
      local_158 = sVar26;
      switch(a->dims) {
      case 1:
        local_138 = pMVar24;
        if (iVar22 == 1 && uVar53 == 1) {
LAB_003ef07c:
          local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
          iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                             (a,pMVar24,c,opt);
          return iVar22;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
          if (c->data != (void *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((uint)local_160 != 1 || a[1].w != 1) {
              binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                        (a,pMVar24,c,local_168);
              return 0;
            }
            goto LAB_003fa01e;
          }
          break;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar34 = (undefined1 (*) [32])c->data;
          if (pauVar34 != (undefined1 (*) [32])0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar3) {
              pauVar49 = (undefined1 (*) [32])a->data;
              pauVar50 = (undefined1 (*) [32])a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar56 = *pauVar49;
                  uVar43 = uVar44;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*pauVar50);
                    *pauVar34 = auVar10;
                    pauVar50 = pauVar50 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar49 = pauVar49 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data != (void *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data != (void *)0x0) {
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          break;
        default:
          goto LAB_003fd127;
        }
        return -100;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar3) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (a[1].cstep * uVar25 * a[1].elemsize + (long)a[1].data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)a->w * uVar25 * a->elemsize + (long)a->data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *pauVar50;
                      uVar43 = uVar44;
                      do {
                        auVar10 = vmaxps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar40) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140[1].cstep * uVar25 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)local_140->w * uVar25 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      auVar56 = *pauVar50;
                      uVar53 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            auVar10 = vmaxps_avx(auVar56,*pauVar49);
                            *pauVar34 = auVar10;
                            pauVar49 = pauVar49 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    pauVar50 = pauVar50 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar23 = local_140[1].dims;
        if (iVar23 == 1) {
          Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
          pauVar34 = (undefined1 (*) [32])c->data;
          if (pauVar34 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar43) {
              pauVar49 = (undefined1 (*) [32])local_140->data;
              pauVar50 = (undefined1 (*) [32])local_140[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar53) {
                  auVar56 = *pauVar50;
                  uVar44 = uVar53;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*pauVar49);
                    *pauVar34 = auVar10;
                    pauVar49 = pauVar49 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
LAB_003fa01e:
          iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                             (a,pMVar24,c,local_168);
          return iVar22;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_140 = a;
            local_138 = pMVar24;
            Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if (0 < (int)uVar4) {
                uVar25 = 0;
                do {
                  if (0 < iVar40) {
                    pauVar34 = (undefined1 (*) [32])
                               (c->cstep * uVar25 * c->elemsize + (long)c->data);
                    pauVar49 = (undefined1 (*) [32])
                               (local_140[1].cstep * uVar25 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    pauVar50 = (undefined1 (*) [32])
                               (local_140->cstep * uVar25 * local_140->elemsize +
                               (long)local_140->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar56 = *pauVar50;
                            uVar43 = uVar44;
                            do {
                              auVar10 = vmaxps_avx(auVar56,*pauVar49);
                              *pauVar34 = auVar10;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar50 = pauVar50 + 1;
                          uVar53 = uVar53 + 1;
                        } while (uVar53 != uVar3);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar40);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar27);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims != 1) {
            if (local_140[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)local_140[1].w * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140->cstep * uVar27 * local_140->elemsize +
                             (long)local_140->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *pauVar50;
                      uVar44 = uVar53;
                      do {
                        auVar10 = vmaxps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)pMVar24->data + uVar27 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140->cstep;
                  sVar8 = local_140->elemsize;
                  pvVar35 = local_140->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa01e;
        }
        if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])
                             ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                  pvVar52 = c->data;
                  sVar7 = a->cstep;
                  sVar8 = a->elemsize;
                  pvVar35 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  sVar7 = a->cstep;
                  pvVar52 = c->data;
                  pvVar35 = a[1].data;
                  sVar8 = a->elemsize;
                  pvVar55 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar35 + lVar28);
                    auVar11._4_4_ = uVar1;
                    auVar11._0_4_ = uVar1;
                    auVar11._8_4_ = uVar1;
                    auVar11._12_4_ = uVar1;
                    auVar11._16_4_ = uVar1;
                    auVar11._20_4_ = uVar1;
                    auVar11._24_4_ = uVar1;
                    auVar11._28_4_ = uVar1;
                    auVar56 = vmaxps_avx512vl(*(undefined1 (*) [32])
                                               ((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar27)
                                              ,auVar11);
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 * 8 + sVar26 * sVar5 * uVar27) =
                         auVar56;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_150 = (__m512 *)sVar5;
        if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar25 * a->elemsize);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar44 == uVar53) && (iVar22 == 1)) && ((uVar3 == uVar43 && (uVar42 == 1)))) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  pvVar52 = a->data;
                  pvVar35 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar52 + lVar28);
                    auVar62._4_4_ = uVar1;
                    auVar62._0_4_ = uVar1;
                    auVar62._8_4_ = uVar1;
                    auVar62._12_4_ = uVar1;
                    auVar62._16_4_ = uVar1;
                    auVar62._20_4_ = uVar1;
                    auVar62._24_4_ = uVar1;
                    auVar62._28_4_ = uVar1;
                    auVar56 = vmaxps_avx(auVar62,*(undefined1 (*) [32])
                                                  ((long)pvVar55 +
                                                  lVar28 * 8 + sVar7 * sVar8 * uVar25));
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 * 8 + sVar26 * sVar5 * uVar25) =
                         auVar56;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = a[1].cstep;
                  sVar5 = a[1].elemsize;
                  pvVar52 = a[1].data;
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])(a->cstep * uVar25 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar41 * 0x20 + sVar26 * uVar25 * sVar5);
                      uVar42 = uVar53;
                      do {
                        auVar10 = vmaxps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_148 = uVar27;
        if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = local_140[1].elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140->cstep * uVar27 * local_140->elemsize +
                                    (long)local_140->data);
                  sVar5 = local_140[1].cstep;
                  pvVar52 = local_140[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      lVar28 = 0;
                      do {
                        auVar56 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar28),
                                             *(undefined1 (*) [32])
                                              ((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27));
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar56;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar53 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->cstep;
                  sVar5 = local_140->elemsize;
                  pvVar52 = local_140->data;
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140[1].cstep * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  uVar25 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar25 * 0x20 + sVar26 * uVar27 * sVar5);
                      uVar53 = uVar44;
                      do {
                        auVar10 = vmaxps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar53 = uVar53 - 1;
                      } while (uVar53 != 0);
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_138 = pMVar24;
        local_130 = c;
        if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_148) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                    (long)local_140[1].data);
                  sVar5 = local_140->cstep;
                  pvVar52 = local_140->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar28 = 0;
                      do {
                        auVar56 = vmaxps_avx(*(undefined1 (*) [32])
                                              ((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27),
                                             *(undefined1 (*) [32])((long)pvVar55 + lVar28));
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar56;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar44 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003fd188;
      case 4:
        local_138 = pMVar24;
        if (a[1].dims != 4) {
          local_148 = uVar25;
          Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          iVar22 = a[1].dims;
          if (iVar22 != 1) {
            if (iVar22 == 3) {
              if (0 < (int)local_148) {
                sVar26 = 0;
                do {
                  if (0 < iVar30) {
                    pauVar34 = (undefined1 (*) [32])
                               (c->cstep * sVar26 * c->elemsize + (long)c->data);
                    pauVar50 = (undefined1 (*) [32])
                               (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                    pauVar49 = (undefined1 (*) [32])
                               (a->cstep * sVar26 * a->elemsize + (long)a->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar53) {
                            auVar56 = *pauVar50;
                            uVar44 = uVar53;
                            do {
                              auVar10 = vmaxps_avx(auVar56,*pauVar49);
                              *pauVar34 = auVar10;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar50 = pauVar50 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar30);
                  }
                  sVar26 = sVar26 + 1;
                } while (sVar26 != local_148);
                return 0;
              }
              return 0;
            }
            if (iVar22 != 2) {
              return 0;
            }
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar49 = (undefined1 (*) [32])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar56 = *pauVar50;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar53;
                        if (0 < (int)uVar53) {
                          do {
                            auVar10 = vmaxps_avx(auVar56,*pauVar49);
                            *pauVar34 = auVar10;
                            pauVar49 = pauVar49 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar50 = pauVar50 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          pMVar24 = local_138;
          if ((uint)local_160 != 1 || a[1].w != 1) {
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_138->data + sVar26 * 0x20);
                  pvVar52 = a->data;
                  sVar8 = c->cstep;
                  sVar9 = c->elemsize;
                  pvVar35 = c->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vmaxps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26))
                    ;
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa01e;
        }
        goto LAB_003f0225;
      }
      goto LAB_003f3fed;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      uVar53 = a->w;
      uVar43 = a->h;
      iVar30 = a->d;
      uVar42 = a->c;
      uVar25 = (ulong)uVar42;
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
      sVar26 = a->elemsize;
      uVar44 = a[1].w;
      uVar3 = a[1].h;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      uVar27 = (ulong)uVar4;
      iVar39 = uVar3 * uVar44 * iVar40;
      sVar5 = a[1].elemsize;
      local_158 = sVar26;
      switch(a->dims) {
      case 1:
        local_138 = pMVar24;
        if (iVar22 == 1 && uVar53 == 1) {
LAB_003ef20c:
          local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
          iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                             (a,pMVar24,c,opt);
          return iVar22;
        }
        switch(a[1].dims) {
        case 1:
          local_140 = a;
          Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                      (local_140,pMVar24,c,local_168);
            return 0;
          }
          break;
        case 2:
          local_140 = a;
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar34 = (undefined1 (*) [32])c->data;
          if (pauVar34 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar49 = (undefined1 (*) [32])local_140->data;
              pauVar50 = (undefined1 (*) [32])local_140[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar56 = *pauVar49;
                  uVar43 = uVar44;
                  do {
                    auVar10 = vminps_avx(auVar56,*pauVar50);
                    *pauVar34 = auVar10;
                    pauVar50 = pauVar50 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar49 = pauVar49 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          local_140 = a;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_140->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140[1].cstep;
                  sVar8 = local_140[1].elemsize;
                  pvVar35 = local_140[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          local_140 = a;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_140->data + uVar25 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140[1].cstep;
                  sVar8 = local_140[1].elemsize;
                  pvVar35 = local_140[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          goto LAB_003fd127;
        }
LAB_003fa35b:
        iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                           (a,pMVar24,c,local_168);
        return iVar22;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar3) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (a[1].cstep * uVar25 * a[1].elemsize + (long)a[1].data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)a->w * uVar25 * a->elemsize + (long)a->data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *pauVar50;
                      uVar43 = uVar44;
                      do {
                        auVar10 = vminps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar40) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140[1].cstep * uVar25 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)local_140->w * uVar25 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      auVar56 = *pauVar50;
                      uVar53 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            auVar10 = vminps_avx(auVar56,*pauVar49);
                            *pauVar34 = auVar10;
                            pauVar49 = pauVar49 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    pauVar50 = pauVar50 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar23 = local_140[1].dims;
        if (iVar23 == 1) {
          Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
          pauVar34 = (undefined1 (*) [32])c->data;
          if (pauVar34 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar43) {
              pauVar49 = (undefined1 (*) [32])local_140->data;
              pauVar50 = (undefined1 (*) [32])local_140[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar53) {
                  auVar56 = *pauVar50;
                  uVar44 = uVar53;
                  do {
                    auVar10 = vminps_avx(auVar56,*pauVar49);
                    *pauVar34 = auVar10;
                    pauVar49 = pauVar49 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa35b;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_140 = a;
            local_138 = pMVar24;
            Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if (0 < (int)uVar4) {
                uVar25 = 0;
                do {
                  if (0 < iVar40) {
                    pauVar34 = (undefined1 (*) [32])
                               (c->cstep * uVar25 * c->elemsize + (long)c->data);
                    pauVar49 = (undefined1 (*) [32])
                               (local_140[1].cstep * uVar25 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    pauVar50 = (undefined1 (*) [32])
                               (local_140->cstep * uVar25 * local_140->elemsize +
                               (long)local_140->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar56 = *pauVar50;
                            uVar43 = uVar44;
                            do {
                              auVar10 = vminps_avx(auVar56,*pauVar49);
                              *pauVar34 = auVar10;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar50 = pauVar50 + 1;
                          uVar53 = uVar53 + 1;
                        } while (uVar53 != uVar3);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar40);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar27);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims != 1) {
            if (local_140[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)local_140[1].w * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140->cstep * uVar27 * local_140->elemsize +
                             (long)local_140->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *pauVar50;
                      uVar44 = uVar53;
                      do {
                        auVar10 = vminps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          a = local_140;
          if ((uint)local_160 != 1 || local_140[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)pMVar24->data + uVar27 * 0x20);
                  pvVar52 = c->data;
                  sVar7 = local_140->cstep;
                  sVar8 = local_140->elemsize;
                  pvVar35 = local_140->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa35b;
        }
        local_148 = sVar5;
        if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])
                             ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                  pvVar52 = c->data;
                  sVar7 = a->cstep;
                  sVar8 = a->elemsize;
                  pvVar35 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar27 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  sVar7 = a->cstep;
                  pvVar52 = c->data;
                  pvVar35 = a[1].data;
                  sVar8 = a->elemsize;
                  pvVar55 = a->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar35 + lVar28);
                    auVar10._4_4_ = uVar1;
                    auVar10._0_4_ = uVar1;
                    auVar10._8_4_ = uVar1;
                    auVar10._12_4_ = uVar1;
                    auVar10._16_4_ = uVar1;
                    auVar10._20_4_ = uVar1;
                    auVar10._24_4_ = uVar1;
                    auVar10._28_4_ = uVar1;
                    auVar56 = vminps_avx512vl(*(undefined1 (*) [32])
                                               ((long)pvVar55 + lVar28 * 8 + sVar7 * sVar8 * uVar27)
                                              ,auVar10);
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 * 8 + sVar26 * sVar5 * uVar27) =
                         auVar56;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar25);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar25 * a->elemsize);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar25))
                    ;
                    *(undefined1 (*) [32])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar25) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 == uVar53) && (iVar22 == 1)) && (uVar3 == uVar43)) && (uVar42 == 1)) {
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  pvVar52 = a->data;
                  pvVar35 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar52 + lVar28);
                    auVar64._4_4_ = uVar1;
                    auVar64._0_4_ = uVar1;
                    auVar64._8_4_ = uVar1;
                    auVar64._12_4_ = uVar1;
                    auVar64._16_4_ = uVar1;
                    auVar64._20_4_ = uVar1;
                    auVar64._24_4_ = uVar1;
                    auVar64._28_4_ = uVar1;
                    auVar56 = vminps_avx(auVar64,*(undefined1 (*) [32])
                                                  ((long)pvVar55 +
                                                  lVar28 * 8 + sVar7 * sVar8 * uVar25));
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 * 8 + sVar26 * sVar5 * uVar25) =
                         auVar56;
                    lVar28 = lVar28 + 4;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              uVar25 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = a[1].cstep;
                  sVar5 = a[1].elemsize;
                  pvVar52 = a[1].data;
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar25 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])(a->cstep * uVar25 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar41 * 0x20 + sVar26 * uVar25 * sVar5);
                      uVar42 = uVar53;
                      do {
                        auVar10 = vminps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar27);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_150 = (__m512 *)uVar27;
        if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_150) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar26 = local_140[1].elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140->cstep * uVar27 * local_140->elemsize +
                                    (long)local_140->data);
                  sVar5 = local_140[1].cstep;
                  pvVar52 = local_140[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar53) {
                      lVar28 = 0;
                      do {
                        auVar56 = vminps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar28),
                                             *(undefined1 (*) [32])
                                              ((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27));
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar56;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar53 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar27 = uVar27 + 1;
              } while ((__m512 *)uVar27 != local_150);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
          local_140 = a;
          local_138 = pMVar24;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_150) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->cstep;
                  sVar5 = local_140->elemsize;
                  pvVar52 = local_140->data;
                  pauVar34 = (undefined1 (*) [32])(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140[1].cstep * uVar27 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  uVar25 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar56 = *(undefined1 (*) [32])
                                 ((long)pvVar52 + uVar25 * 0x20 + sVar26 * uVar27 * sVar5);
                      uVar53 = uVar44;
                      do {
                        auVar10 = vminps_avx(auVar56,*pauVar49);
                        *pauVar34 = auVar10;
                        pauVar49 = pauVar49 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar53 = uVar53 - 1;
                      } while (uVar53 != 0);
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while ((__m512 *)uVar27 != local_150);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_138 = pMVar24;
        if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_150) {
              uVar27 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar26 = local_140->elemsize;
                  pvVar35 = (void *)(c->cstep * uVar27 * c->elemsize + (long)c->data);
                  pvVar55 = (void *)(local_140[1].cstep * uVar27 * local_140[1].elemsize +
                                    (long)local_140[1].data);
                  sVar5 = local_140->cstep;
                  pvVar52 = local_140->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar28 = 0;
                      do {
                        auVar56 = vminps_avx(*(undefined1 (*) [32])
                                              ((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27),
                                             *(undefined1 (*) [32])((long)pvVar55 + lVar28));
                        *(undefined1 (*) [32])((long)pvVar35 + lVar28) = auVar56;
                        lVar28 = lVar28 + 0x20;
                      } while ((ulong)uVar44 << 5 != lVar28);
                      pvVar35 = (void *)((long)pvVar35 + lVar28);
                      pvVar55 = (void *)((long)pvVar55 + lVar28);
                    }
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar3);
                }
                uVar27 = uVar27 + 1;
              } while ((__m512 *)uVar27 != local_150);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003fd1d6;
      case 4:
        local_138 = pMVar24;
        if (a[1].dims != 4) {
          local_148 = uVar25;
          Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          iVar22 = a[1].dims;
          if (iVar22 != 1) {
            if (iVar22 == 3) {
              if (0 < (int)local_148) {
                sVar26 = 0;
                do {
                  if (0 < iVar30) {
                    pauVar34 = (undefined1 (*) [32])
                               (c->cstep * sVar26 * c->elemsize + (long)c->data);
                    pauVar50 = (undefined1 (*) [32])
                               (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                    pauVar49 = (undefined1 (*) [32])
                               (a->cstep * sVar26 * a->elemsize + (long)a->data);
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar53) {
                            auVar56 = *pauVar50;
                            uVar44 = uVar53;
                            do {
                              auVar10 = vminps_avx(auVar56,*pauVar49);
                              *pauVar34 = auVar10;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar50 = pauVar50 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar30);
                  }
                  sVar26 = sVar26 + 1;
                } while (sVar26 != local_148);
                return 0;
              }
              return 0;
            }
            if (iVar22 != 2) {
              return 0;
            }
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar34 = (undefined1 (*) [32])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar50 = (undefined1 (*) [32])
                             ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar49 = (undefined1 (*) [32])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar56 = *pauVar50;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar53;
                        if (0 < (int)uVar53) {
                          do {
                            auVar10 = vminps_avx(auVar56,*pauVar49);
                            *pauVar34 = auVar10;
                            pauVar49 = pauVar49 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar50 = pauVar50 + 1;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          pMVar24 = local_138;
          if ((uint)local_160 != 1 || a[1].w != 1) {
            if (0 < (int)local_148) {
              sVar26 = 0;
              do {
                if (0 < (int)local_150) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar56 = *(undefined1 (*) [32])((long)local_138->data + sVar26 * 0x20);
                  pvVar52 = a->data;
                  sVar8 = c->cstep;
                  sVar9 = c->elemsize;
                  pvVar35 = c->data;
                  lVar28 = 0;
                  iVar22 = (int)local_150;
                  do {
                    auVar10 = vminps_avx(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26))
                    ;
                    *(undefined1 (*) [32])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) =
                         auVar10;
                    lVar28 = lVar28 + 0x20;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_148);
              return 0;
            }
            return 0;
          }
          goto LAB_003fa35b;
        }
        goto LAB_003f0b20;
      }
      goto LAB_003f4844;
    case 6:
      if (a->dims - 1U < 4) {
        uVar53 = a->w;
        local_150 = (__m512 *)(ulong)uVar53;
        uVar43 = a->h;
        local_160 = (__m512 *)(ulong)uVar43;
        iVar22 = a->d;
        uVar42 = a->c;
        uVar27 = (ulong)uVar42;
        local_138 = (Mat *)CONCAT44(local_138._4_4_,uVar43 * uVar53 * iVar22);
        local_118 = a->elemsize;
        local_11c = a->elempack;
        uVar44 = a[1].w;
        local_168 = (Option *)(ulong)uVar44;
        uVar3 = a[1].h;
        iVar23 = a[1].d;
        uVar4 = a[1].c;
        local_148 = (ulong)uVar4;
        local_158 = CONCAT44(local_158._4_4_,iVar23);
        iVar40 = uVar3 * uVar44 * iVar23;
        local_108 = a[1].elemsize;
        iVar30 = a[1].elempack;
        switch(a->dims) {
        case 1:
          if (local_11c == 1 && uVar53 == 1) {
            iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                               (a,pMVar24,c,opt);
            return iVar22;
          }
          switch(a[1].dims) {
          case 1:
            local_140 = a;
            local_138 = pMVar24;
            Mat::create(c,uVar53,local_118,local_11c,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            pMVar24 = local_138;
            if (iVar30 == 1 && local_140[1].w == 1) goto LAB_003fa2e9;
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                      (local_140,local_138,c,opt);
            break;
          case 2:
            local_140 = a;
            Mat::create(c,uVar44,uVar3,local_108,iVar30,opt->blob_allocator);
            puVar33 = (undefined8 *)c->data;
            if (puVar33 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if (0 < (int)uVar3) {
                local_160 = (__m512 *)local_140->data;
                pauVar34 = (undefined1 (*) [32])local_140[1].data;
                local_150 = (__m512 *)((ulong)local_150 & 0xffffffff00000000);
                do {
                  local_c0[0]._0_32_ = *(undefined1 (*) [32])local_160;
                  uVar27 = (ulong)local_168 & 0xffffffff;
                  if (0 < (int)local_168) {
                    do {
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)((long)*pauVar34 + 8);
                      uVar68 = *(undefined8 *)((long)*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)((long)*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      pauVar34 = pauVar34 + 1;
                      puVar33 = puVar33 + 4;
                      uVar53 = (int)uVar27 - 1;
                      uVar27 = (ulong)uVar53;
                    } while (uVar53 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 0x20);
                  uVar53 = (int)local_150 + 1;
                  local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar53);
                } while (uVar53 != uVar3);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar40);
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_160 = (__m512 *)0x0;
                do {
                  local_c0[0]._0_32_ =
                       *(undefined1 (*) [32])((long)local_140->data + (long)local_160 * 0x20);
                  if (0 < (int)local_138) {
                    lVar51 = local_130->cstep * local_130->elemsize * (long)local_160;
                    pvVar52 = local_130->data;
                    local_168 = (Option *)
                                (local_140[1].cstep * local_140[1].elemsize * (long)local_160 +
                                (long)local_140[1].data);
                    lVar28 = 0;
                    iVar22 = (int)local_138;
                    do {
                      pauVar34 = (undefined1 (*) [32])((long)local_168 + lVar28);
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)(*pauVar34 + 8);
                      uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                      puVar33 = (undefined8 *)((long)pvVar52 + lVar28 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      lVar28 = lVar28 + 0x20;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          case 4:
            local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar40);
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,iVar23,uVar4,local_108,iVar30,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_160 = (__m512 *)0x0;
                do {
                  local_c0[0]._0_32_ =
                       *(undefined1 (*) [32])((long)local_140->data + (long)local_160 * 0x20);
                  if (0 < (int)local_138) {
                    lVar51 = local_130->cstep * local_130->elemsize * (long)local_160;
                    pvVar52 = local_130->data;
                    local_168 = (Option *)
                                (local_140[1].cstep * local_140[1].elemsize * (long)local_160 +
                                (long)local_140[1].data);
                    lVar28 = 0;
                    iVar22 = (int)local_138;
                    do {
                      pauVar34 = (undefined1 (*) [32])((long)local_168 + lVar28);
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)(*pauVar34 + 8);
                      uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                      puVar33 = (undefined8 *)((long)pvVar52 + lVar28 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      lVar28 = lVar28 + 0x20;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          break;
        case 2:
          pAVar6 = opt->blob_allocator;
          if (a[1].dims == 3) {
            local_140 = a;
            local_130 = c;
            local_10c = iVar30;
            Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,pAVar6);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_158 = 0;
                do {
                  if (0 < (int)uVar3) {
                    pauVar34 = (undefined1 (*) [32])
                               (local_130->cstep * local_158 * local_130->elemsize +
                               (long)local_130->data);
                    pauVar49 = (undefined1 (*) [32])
                               (local_140[1].cstep * local_158 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    local_160 = (__m512 *)
                                ((long)local_140->w * local_158 * local_140->elemsize +
                                (long)local_140->data);
                    uVar53 = 0;
                    do {
                      local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar53);
                      local_c0[0]._0_32_ = *(undefined1 (*) [32])local_160;
                      uVar27 = (ulong)local_168 & 0xffffffff;
                      if (0 < (int)local_168) {
                        do {
                          auVar56 = *pauVar49;
                          local_100[0] = (float)auVar56._0_4_;
                          local_100[1] = (float)auVar56._4_4_;
                          local_100[2] = (float)auVar56._8_4_;
                          local_100[3] = (float)auVar56._12_4_;
                          local_100[4] = (float)auVar56._16_4_;
                          local_100[5] = (float)auVar56._20_4_;
                          local_100[6] = (float)auVar56._24_4_;
                          local_100[7] = (float)auVar56._28_4_;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                    (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                          *pauVar34 = auVar56;
                          pauVar49 = pauVar49 + 1;
                          pauVar34 = pauVar34 + 1;
                          uVar53 = (int)uVar27 - 1;
                          uVar27 = (ulong)uVar53;
                        } while (uVar53 != 0);
                      }
                      local_160 = (__m512 *)((long)local_160 + 0x20);
                      uVar53 = (int)local_150 + 1;
                    } while (uVar53 != uVar3);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            local_140 = a;
            local_130 = c;
            local_10c = iVar30;
            Mat::create(c,uVar44,uVar3,iVar23,uVar4,local_108,iVar30,pAVar6);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_128 = 0;
                do {
                  if (0 < (int)local_158) {
                    pauVar34 = (undefined1 (*) [32])
                               (local_130->cstep * local_128 * local_130->elemsize +
                               (long)local_130->data);
                    pauVar49 = (undefined1 (*) [32])
                               (local_140[1].cstep * local_128 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    local_150 = (__m512 *)
                                ((long)local_140->w * local_128 * local_140->elemsize +
                                (long)local_140->data);
                    iVar22 = 0;
                    do {
                      local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                      local_c0[0]._0_32_ = *(undefined1 (*) [32])local_150;
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          local_160 = (__m512 *)CONCAT44(local_160._4_4_,uVar53);
                          uVar27 = (ulong)local_168 & 0xffffffff;
                          if (0 < (int)local_168) {
                            do {
                              auVar56 = *pauVar49;
                              local_100[0] = (float)auVar56._0_4_;
                              local_100[1] = (float)auVar56._4_4_;
                              local_100[2] = (float)auVar56._8_4_;
                              local_100[3] = (float)auVar56._12_4_;
                              local_100[4] = (float)auVar56._16_4_;
                              local_100[5] = (float)auVar56._20_4_;
                              local_100[6] = (float)auVar56._24_4_;
                              local_100[7] = (float)auVar56._28_4_;
                              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                        (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                              *pauVar34 = auVar56;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar53 = (int)uVar27 - 1;
                              uVar27 = (ulong)uVar53;
                            } while (uVar53 != 0);
                          }
                          uVar53 = (uint)local_160 + 1;
                        } while (uVar53 != uVar3);
                      }
                      local_150 = (__m512 *)((long)local_150 + 0x20);
                      iVar22 = (int)local_138 + 1;
                    } while (iVar22 != (int)local_158);
                  }
                  local_128 = local_128 + 1;
                } while (local_128 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_10c = iVar30;
          Mat::create(c,uVar53,uVar43,local_118,local_11c,pAVar6);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims == 1) {
            Mat::create(c,uVar53,(int)local_160,local_118,local_11c,opt->blob_allocator);
            puVar33 = (undefined8 *)c->data;
            if (puVar33 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if (local_10c != 1 || local_140[1].w != 1) {
              if (0 < (int)(uint)local_160) {
                pauVar34 = (undefined1 (*) [32])local_140->data;
                local_178 = (__m512 *)local_140[1].data;
                local_168 = (Option *)((ulong)local_168 & 0xffffffff00000000);
                do {
                  local_c0[0]._0_32_ = *(undefined1 (*) [32])local_178;
                  uVar27 = (ulong)local_150 & 0xffffffff;
                  if (0 < (int)local_150) {
                    do {
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)((long)*pauVar34 + 8);
                      uVar68 = *(undefined8 *)((long)*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)((long)*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      pauVar34 = pauVar34 + 1;
                      puVar33 = puVar33 + 4;
                      uVar53 = (int)uVar27 - 1;
                      uVar27 = (ulong)uVar53;
                    } while (uVar53 != 0);
                  }
                  local_178 = (__m512 *)((long)local_178 + 0x20);
                  iVar22 = (int)local_168 + 1;
                  local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
                } while (iVar22 != (uint)local_160);
                return 0;
              }
              return 0;
            }
LAB_003fa2e9:
            iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                               (local_140,pMVar24,c,opt);
            return iVar22;
          }
          a = local_140;
          if (local_140[1].dims != 2) {
            return 0;
          }
LAB_003f0b4b:
          iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                             (a,pMVar24,c,opt);
          return iVar22;
        case 3:
          if (a[1].dims == 3) {
            if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
              local_140 = a;
              local_130 = c;
              local_10c = iVar30;
              Mat::create(c,uVar53,uVar43,uVar42,local_118,local_11c,opt->blob_allocator);
              if (local_130->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)uVar42) {
                  local_160 = (__m512 *)0x0;
                  local_128 = uVar27;
                  do {
                    pvVar52 = local_140->data;
                    local_c0[0]._0_32_ =
                         *(undefined1 (*) [32])
                          ((long)local_140[1].data +
                          local_140[1].cstep * (long)local_160 * local_140[1].elemsize);
                    if (0 < (int)local_138) {
                      local_168 = (Option *)
                                  ((long)local_130->data +
                                  local_130->cstep * local_130->elemsize * (long)local_160);
                      lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                      lVar51 = 0;
                      iVar22 = (int)local_138;
                      do {
                        pauVar34 = (undefined1 (*) [32])((long)pvVar52 + lVar51 + lVar28);
                        uVar60 = *(undefined8 *)*pauVar34;
                        uVar67 = *(undefined8 *)(*pauVar34 + 8);
                        uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                        uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                        local_100._0_32_ = *pauVar34;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                        puVar33 = (undefined8 *)((long)local_168 + lVar51);
                        *puVar33 = uVar60;
                        puVar33[1] = uVar67;
                        puVar33[2] = uVar68;
                        puVar33[3] = uVar69;
                        lVar51 = lVar51 + 0x20;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    local_160 = (__m512 *)((long)local_160 + 1);
                  } while (local_160 != (__m512 *)local_128);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar44 == uVar53) && (iVar30 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
              local_140 = a;
              local_130 = c;
              local_128 = uVar27;
              local_10c = iVar30;
              Mat::create(c,uVar53,uVar43,uVar42,local_118,local_11c,opt->blob_allocator);
              if (local_130->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_128) {
                  local_150 = (__m512 *)0x0;
                  do {
                    if (0 < (int)local_138) {
                      lVar28 = local_130->cstep * local_130->elemsize * (long)local_150;
                      pvVar52 = local_130->data;
                      local_160 = (__m512 *)local_140[1].data;
                      local_168 = (Option *)
                                  (local_140->cstep * local_140->elemsize * (long)local_150 +
                                  (long)local_140->data);
                      lVar51 = 0;
                      iVar22 = (int)local_138;
                      do {
                        local_c0[0]._0_32_ = *(undefined1 (*) [32])((long)local_168 + lVar51 * 8);
                        uVar1 = *(undefined4 *)((long)local_160 + lVar51);
                        auVar56._4_4_ = uVar1;
                        auVar56._0_4_ = uVar1;
                        auVar56._8_4_ = uVar1;
                        auVar56._12_4_ = uVar1;
                        auVar56._16_4_ = uVar1;
                        auVar56._20_4_ = uVar1;
                        auVar56._24_4_ = uVar1;
                        auVar56._28_4_ = uVar1;
                        local_100[0] = (float)uVar1;
                        local_100[1] = (float)uVar1;
                        local_100[2] = (float)uVar1;
                        local_100[3] = (float)uVar1;
                        local_100[4] = (float)uVar1;
                        local_100[5] = (float)uVar1;
                        local_100[6] = (float)uVar1;
                        local_100[7] = (float)uVar1;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                        *(undefined1 (*) [32])((long)pvVar52 + lVar51 * 8 + lVar28) = auVar56;
                        lVar51 = lVar51 + 4;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    local_150 = (__m512 *)((long)local_150 + 1);
                  } while (local_150 != (__m512 *)local_128);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar40);
            if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
              local_140 = a;
              local_130 = c;
              local_10c = iVar30;
              Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,opt->blob_allocator);
              if (local_130->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  local_160 = (__m512 *)0x0;
                  do {
                    pvVar52 = local_140[1].data;
                    local_c0[0]._0_32_ =
                         *(undefined1 (*) [32])
                          ((long)local_140->data +
                          local_140->cstep * (long)local_160 * local_140->elemsize);
                    if (0 < (int)local_138) {
                      local_168 = (Option *)
                                  ((long)local_130->data +
                                  local_130->cstep * local_130->elemsize * (long)local_160);
                      lVar28 = local_140[1].cstep * local_140[1].elemsize * (long)local_160;
                      lVar51 = 0;
                      iVar22 = (int)local_138;
                      do {
                        pauVar34 = (undefined1 (*) [32])((long)pvVar52 + lVar51 + lVar28);
                        uVar60 = *(undefined8 *)*pauVar34;
                        uVar67 = *(undefined8 *)(*pauVar34 + 8);
                        uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                        uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                        local_100._0_32_ = *pauVar34;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                        puVar33 = (undefined8 *)((long)local_168 + lVar51);
                        *puVar33 = uVar60;
                        puVar33[1] = uVar67;
                        puVar33[2] = uVar68;
                        puVar33[3] = uVar69;
                        lVar51 = lVar51 + 0x20;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    local_160 = (__m512 *)((long)local_160 + 1);
                  } while (local_160 != (__m512 *)local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar44 == uVar53) && (local_11c == 1 && (uVar42 == 1 && uVar3 == uVar43))) {
              local_140 = a;
              local_130 = c;
              local_10c = iVar30;
              Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,opt->blob_allocator);
              if (local_130->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  local_150 = (__m512 *)0x0;
                  do {
                    if (0 < (int)local_138) {
                      local_168 = (Option *)local_140->data;
                      lVar28 = local_130->cstep * local_130->elemsize * (long)local_150;
                      pvVar52 = local_130->data;
                      local_160 = (__m512 *)
                                  (local_140[1].cstep * local_140[1].elemsize * (long)local_150 +
                                  (long)local_140[1].data);
                      lVar51 = 0;
                      iVar22 = (int)local_138;
                      do {
                        afVar59 = local_c0[0];
                        local_c0[0][1] = *(float *)((long)local_168 + lVar51);
                        local_c0[0][0] = local_c0[0][1];
                        local_c0[0][2] = local_c0[0][1];
                        local_c0[0][3] = local_c0[0][1];
                        local_c0[0][4] = local_c0[0][1];
                        local_c0[0][5] = local_c0[0][1];
                        local_c0[0][6] = local_c0[0][1];
                        local_c0[0]._32_32_ = afVar59._32_32_;
                        local_c0[0][7] = local_c0[0][1];
                        auVar56 = *(undefined1 (*) [32])((long)local_160 + lVar51 * 8);
                        local_100[0] = (float)auVar56._0_4_;
                        local_100[1] = (float)auVar56._4_4_;
                        local_100[2] = (float)auVar56._8_4_;
                        local_100[3] = (float)auVar56._12_4_;
                        local_100[4] = (float)auVar56._16_4_;
                        local_100[5] = (float)auVar56._20_4_;
                        local_100[6] = (float)auVar56._24_4_;
                        local_100[7] = (float)auVar56._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                        *(undefined1 (*) [32])((long)pvVar52 + lVar51 * 8 + lVar28) = auVar56;
                        lVar51 = lVar51 + 4;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    local_150 = (__m512 *)((long)local_150 + 1);
                  } while (local_150 != (__m512 *)local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
              local_140 = a;
              local_130 = c;
              local_128 = uVar27;
              local_10c = iVar30;
              Mat::create(c,uVar53,uVar43,uVar42,local_118,local_11c,opt->blob_allocator);
              if (local_130->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  local_158 = 0;
                  do {
                    if (0 < (int)(uint)local_160) {
                      local_168 = (Option *)
                                  (local_140[1].cstep * local_158 * local_140[1].elemsize +
                                  (long)local_140[1].data);
                      pauVar34 = (undefined1 (*) [32])
                                 (local_130->cstep * local_158 * local_130->elemsize +
                                 (long)local_130->data);
                      pauVar49 = (undefined1 (*) [32])
                                 (local_140->cstep * local_158 * local_140->elemsize +
                                 (long)local_140->data);
                      uVar27 = 0;
                      do {
                        local_c0[0]._0_32_ = *(undefined1 (*) [32])((long)local_168 + uVar27 * 0x20)
                        ;
                        uVar25 = (ulong)local_150 & 0xffffffff;
                        if (0 < (int)local_150) {
                          do {
                            auVar56 = *pauVar49;
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                            *pauVar34 = auVar56;
                            pauVar49 = pauVar49 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar53 = (int)uVar25 - 1;
                            uVar25 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        uVar27 = uVar27 + 1;
                      } while ((__m512 *)uVar27 != local_160);
                    }
                    local_158 = local_158 + 1;
                  } while (local_158 != local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
              local_140 = a;
              local_138 = pMVar24;
              local_130 = c;
              local_128 = uVar27;
              local_10c = iVar30;
              Mat::create(c,uVar53,uVar43,uVar42,local_118,local_11c,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  lVar28 = (long)local_150 << 5;
                  local_158 = 0;
                  local_168 = (Option *)lVar28;
                  do {
                    if (0 < (int)(uint)local_160) {
                      pvVar35 = (void *)(local_130->cstep * local_158 * local_130->elemsize +
                                        (long)local_130->data);
                      pvVar55 = (void *)(local_140->cstep * local_158 * local_140->elemsize +
                                        (long)local_140->data);
                      lVar51 = local_140[1].elemsize * local_140[1].cstep * local_158;
                      pvVar52 = local_140[1].data;
                      iVar22 = 0;
                      pafVar46 = local_150;
                      do {
                        if (0 < (int)pafVar46) {
                          lVar54 = 0;
                          do {
                            local_c0[0]._0_32_ = *(undefined1 (*) [32])((long)pvVar55 + lVar54);
                            auVar56 = *(undefined1 (*) [32])((long)pvVar52 + lVar54 + lVar51);
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                            *(undefined1 (*) [32])((long)pvVar35 + lVar54) = auVar56;
                            lVar54 = lVar54 + 0x20;
                          } while (lVar28 != lVar54);
                          pvVar35 = (void *)((long)pvVar35 + lVar54);
                          pvVar55 = (void *)((long)pvVar55 + lVar54);
                          pafVar46 = local_150;
                        }
                        iVar22 = iVar22 + 1;
                      } while (iVar22 != (uint)local_160);
                    }
                    local_158 = local_158 + 1;
                  } while (local_158 != local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
              local_140 = a;
              local_138 = pMVar24;
              local_130 = c;
              local_128 = uVar27;
              local_10c = iVar30;
              Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  local_158 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      local_150 = (__m512 *)
                                  (local_140->cstep * local_158 * local_140->elemsize +
                                  (long)local_140->data);
                      pauVar49 = (undefined1 (*) [32])
                                 (local_130->cstep * local_158 * local_130->elemsize +
                                 (long)local_130->data);
                      pauVar34 = (undefined1 (*) [32])
                                 (local_140[1].cstep * local_158 * local_140[1].elemsize +
                                 (long)local_140[1].data);
                      local_160 = (__m512 *)0x0;
                      do {
                        local_c0[0]._0_32_ =
                             *(undefined1 (*) [32])((long)local_150 + (long)local_160 * 0x20);
                        uVar27 = (ulong)local_168 & 0xffffffff;
                        if (0 < (int)local_168) {
                          do {
                            auVar56 = *pauVar34;
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                            *pauVar49 = auVar56;
                            pauVar34 = pauVar34 + 1;
                            pauVar49 = pauVar49 + 1;
                            uVar53 = (int)uVar27 - 1;
                            uVar27 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        local_160 = (__m512 *)((long)local_160 + 1);
                      } while (local_160 != (__m512 *)(ulong)uVar3);
                    }
                    local_158 = local_158 + 1;
                  } while (local_158 != local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_140 = a;
            local_138 = pMVar24;
            local_130 = c;
            local_128 = uVar27;
            local_10c = iVar30;
            if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
              Mat::create(c,uVar44,uVar3,uVar4,local_108,iVar30,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_130->c * local_130->cstep != 0) {
                if (0 < (int)local_148) {
                  lVar28 = (long)local_168 << 5;
                  local_138 = (Mat *)0x0;
                  local_158 = lVar28;
                  do {
                    if (0 < (int)uVar3) {
                      pvVar35 = (void *)(local_130->cstep * (long)local_138 * local_130->elemsize +
                                        (long)local_130->data);
                      pvVar52 = (void *)(local_140[1].cstep * (long)local_138 *
                                         local_140[1].elemsize + (long)local_140[1].data);
                      local_150 = (__m512 *)
                                  (local_140->elemsize * local_140->cstep * (long)local_138 +
                                  (long)local_140->data);
                      uVar53 = 0;
                      do {
                        pafVar46 = local_150;
                        if (0 < (int)local_168) {
                          local_160 = (__m512 *)CONCAT44(local_160._4_4_,uVar53);
                          lVar51 = 0;
                          do {
                            local_c0[0]._0_32_ = *(undefined1 (*) [32])((long)pafVar46 + lVar51);
                            auVar56 = *(undefined1 (*) [32])((long)pvVar52 + lVar51);
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                            *(undefined1 (*) [32])((long)pvVar35 + lVar51) = auVar56;
                            lVar51 = lVar51 + 0x20;
                          } while (lVar28 != lVar51);
                          pvVar35 = (void *)((long)pvVar35 + lVar51);
                          pvVar52 = (void *)((long)pvVar52 + lVar51);
                          uVar53 = (uint)local_160;
                        }
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    local_138 = (Mat *)((long)local_138 + 1);
                  } while (local_138 != (Mat *)local_148);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            goto LAB_003f0b4b;
          }
          if (a[1].dims == 4) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,iVar23,uVar4,local_108,iVar30,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_128 = 0;
                do {
                  if (0 < (int)local_158) {
                    pauVar34 = (undefined1 (*) [32])
                               (local_130->cstep * local_128 * local_130->elemsize +
                               (long)local_130->data);
                    pauVar49 = (undefined1 (*) [32])
                               (local_140[1].cstep * local_128 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    local_160 = (__m512 *)
                                (local_140->cstep * local_128 * local_140->elemsize +
                                (long)local_140->data);
                    iVar22 = 0;
                    do {
                      local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                      if (0 < (int)uVar3) {
                        uVar53 = 0;
                        do {
                          local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar53);
                          local_c0[0]._0_32_ = *(undefined1 (*) [32])local_160;
                          uVar27 = (ulong)local_168 & 0xffffffff;
                          if (0 < (int)local_168) {
                            do {
                              auVar56 = *pauVar49;
                              local_100[0] = (float)auVar56._0_4_;
                              local_100[1] = (float)auVar56._4_4_;
                              local_100[2] = (float)auVar56._8_4_;
                              local_100[3] = (float)auVar56._12_4_;
                              local_100[4] = (float)auVar56._16_4_;
                              local_100[5] = (float)auVar56._20_4_;
                              local_100[6] = (float)auVar56._24_4_;
                              local_100[7] = (float)auVar56._28_4_;
                              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                        (&local_169,(__m256 *)local_c0,(__m256 *)local_100);
                              *pauVar34 = auVar56;
                              pauVar49 = pauVar49 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar53 = (int)uVar27 - 1;
                              uVar27 = (ulong)uVar53;
                            } while (uVar53 != 0);
                          }
                          local_160 = (__m512 *)((long)local_160 + 0x20);
                          uVar53 = (int)local_150 + 1;
                        } while (uVar53 != uVar3);
                      }
                      iVar22 = (int)local_138 + 1;
                    } while (iVar22 != (int)local_158);
                  }
                  local_128 = local_128 + 1;
                } while (local_128 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_130 = c;
          local_128 = uVar27;
          Mat::create(c,uVar53,uVar43,uVar42,local_118,local_11c,opt->blob_allocator);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep == 0) {
            return -100;
          }
          if (local_140[1].dims == 1) {
            c = local_130;
            if (iVar30 != 1 || local_140[1].w != 1) {
              if (0 < (int)local_128) {
                local_160 = (__m512 *)0x0;
                do {
                  pvVar52 = local_140->data;
                  local_c0[0]._0_32_ =
                       *(undefined1 (*) [32])((long)local_140[1].data + (long)local_160 * 0x20);
                  if (0 < (int)local_138) {
                    local_168 = (Option *)
                                (local_130->cstep * local_130->elemsize * (long)local_160 +
                                (long)local_130->data);
                    lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                    lVar51 = 0;
                    iVar22 = (int)local_138;
                    do {
                      pauVar34 = (undefined1 (*) [32])((long)pvVar52 + lVar51 + lVar28);
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)(*pauVar34 + 8);
                      uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                      puVar33 = (undefined8 *)((long)local_168 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      lVar51 = lVar51 + 0x20;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_128);
                return 0;
              }
              return 0;
            }
            goto LAB_003fa2e9;
          }
          if (local_140[1].dims == 2) {
            if (0 < (int)local_128) {
              local_158 = 0;
              do {
                if (0 < (int)(uint)local_160) {
                  pauVar50 = (undefined1 (*) [32])
                             (local_130->cstep * local_158 * local_130->elemsize +
                             (long)local_130->data);
                  pauVar34 = (undefined1 (*) [32])
                             ((long)local_140[1].w * local_158 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140->cstep * local_158 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
                    local_c0[0]._0_32_ = *pauVar34;
                    uVar27 = (ulong)local_150 & 0xffffffff;
                    if (0 < (int)local_150) {
                      do {
                        auVar56 = *pauVar49;
                        local_100[0] = (float)auVar56._0_4_;
                        local_100[1] = (float)auVar56._4_4_;
                        local_100[2] = (float)auVar56._8_4_;
                        local_100[3] = (float)auVar56._12_4_;
                        local_100[4] = (float)auVar56._16_4_;
                        local_100[5] = (float)auVar56._20_4_;
                        local_100[6] = (float)auVar56._24_4_;
                        local_100[7] = (float)auVar56._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                        *pauVar50 = auVar56;
                        pauVar49 = pauVar49 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar53 = (int)uVar27 - 1;
                        uVar27 = (ulong)uVar53;
                      } while (uVar53 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar22 = (int)local_168 + 1;
                  } while (iVar22 != (uint)local_160);
                }
                local_158 = local_158 + 1;
              } while (local_158 != local_128);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          local_158 = CONCAT44(local_158._4_4_,iVar22);
          if (a[1].dims == 4) goto LAB_003f0b4b;
          local_140 = a;
          local_130 = c;
          local_128 = uVar27;
          Mat::create(c,uVar53,uVar43,iVar22,uVar42,local_118,local_11c,opt->blob_allocator);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep == 0) {
            return -100;
          }
          iVar22 = local_140[1].dims;
          if (iVar22 == 1) {
            c = local_130;
            if (iVar30 != 1 || local_140[1].w != 1) {
              if (0 < (int)local_128) {
                local_160 = (__m512 *)0x0;
                do {
                  pvVar52 = local_140->data;
                  local_c0[0]._0_32_ =
                       *(undefined1 (*) [32])((long)local_140[1].data + (long)local_160 * 0x20);
                  if (0 < (int)local_138) {
                    lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                    local_168 = (Option *)
                                (local_130->cstep * local_130->elemsize * (long)local_160 +
                                (long)local_130->data);
                    lVar51 = 0;
                    iVar22 = (int)local_138;
                    do {
                      pauVar34 = (undefined1 (*) [32])((long)pvVar52 + lVar51 + lVar28);
                      uVar60 = *(undefined8 *)*pauVar34;
                      uVar67 = *(undefined8 *)(*pauVar34 + 8);
                      uVar68 = *(undefined8 *)(*pauVar34 + 0x10);
                      uVar69 = *(undefined8 *)(*pauVar34 + 0x18);
                      local_100._0_32_ = *pauVar34;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                      puVar33 = (undefined8 *)((long)local_168 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      lVar51 = lVar51 + 0x20;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_128);
                return 0;
              }
              return 0;
            }
            goto LAB_003fa2e9;
          }
          if (iVar22 == 3) {
            if (0 < (int)local_128) {
              local_148 = 0;
              do {
                if (0 < (int)local_158) {
                  pauVar50 = (undefined1 (*) [32])
                             (local_130->cstep * local_148 * local_130->elemsize +
                             (long)local_130->data);
                  pauVar49 = (undefined1 (*) [32])
                             (local_140[1].cstep * local_148 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             (local_140->cstep * local_148 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  pafVar46 = local_160;
                  do {
                    local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                    if (0 < (int)pafVar46) {
                      iVar22 = 0;
                      do {
                        local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
                        local_c0[0]._0_32_ = *pauVar49;
                        uVar27 = (ulong)local_150 & 0xffffffff;
                        if (0 < (int)local_150) {
                          do {
                            auVar56 = *pauVar34;
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                            *pauVar50 = auVar56;
                            pauVar34 = pauVar34 + 1;
                            pauVar50 = pauVar50 + 1;
                            uVar53 = (int)uVar27 - 1;
                            uVar27 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        pauVar49 = pauVar49 + 1;
                        iVar22 = (int)local_168 + 1;
                        pafVar46 = local_160;
                      } while (iVar22 != (int)local_160);
                    }
                    iVar22 = (int)local_138 + 1;
                  } while (iVar22 != (int)local_158);
                }
                local_148 = local_148 + 1;
              } while (local_148 != local_128);
              return 0;
            }
            return 0;
          }
          if (iVar22 == 2) {
            if (0 < (int)local_128) {
              local_148 = 0;
              do {
                if (0 < (int)local_158) {
                  pauVar49 = (undefined1 (*) [32])
                             (local_130->cstep * local_148 * local_130->elemsize +
                             (long)local_130->data);
                  local_168 = (Option *)
                              ((long)local_140[1].w * local_148 * local_140[1].elemsize +
                              (long)local_140[1].data);
                  pauVar34 = (undefined1 (*) [32])
                             (local_140->cstep * local_148 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  pafVar46 = local_160;
                  do {
                    local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                    local_c0[0]._0_32_ = local_168->lightmode;
                    if (0 < (int)pafVar46) {
                      iVar22 = 0;
                      do {
                        uVar27 = (ulong)local_150 & 0xffffffff;
                        if (0 < (int)local_150) {
                          do {
                            auVar56 = *pauVar34;
                            local_100[0] = (float)auVar56._0_4_;
                            local_100[1] = (float)auVar56._4_4_;
                            local_100[2] = (float)auVar56._8_4_;
                            local_100[3] = (float)auVar56._12_4_;
                            local_100[4] = (float)auVar56._16_4_;
                            local_100[5] = (float)auVar56._20_4_;
                            local_100[6] = (float)auVar56._24_4_;
                            local_100[7] = (float)auVar56._28_4_;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                      (&local_169,(__m256 *)local_100,(__m256 *)local_c0);
                            *pauVar49 = auVar56;
                            pauVar34 = pauVar34 + 1;
                            pauVar49 = pauVar49 + 1;
                            uVar53 = (int)uVar27 - 1;
                            uVar27 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        iVar22 = iVar22 + 1;
                        pafVar46 = local_160;
                      } while (iVar22 != (int)local_160);
                    }
                    local_168 = (Option *)((long)local_168 + 0x20);
                    iVar22 = (int)local_138 + 1;
                  } while (iVar22 != (int)local_158);
                }
                local_148 = local_148 + 1;
              } while (local_148 != local_128);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      pMVar36 = a;
      a = pMVar24;
      break;
    case 8:
      pMVar36 = a;
      a = pMVar24;
LAB_003ef2f7:
      iVar22 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar36,c,opt);
      return iVar22;
    default:
      goto switchD_003eebcf_default;
    }
    iVar22 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar36,c,opt);
    return iVar22;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
    uVar53 = a->w;
    uVar43 = a->h;
    iVar30 = a->d;
    uVar42 = a->c;
    local_158 = (size_t)uVar42;
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
    sVar26 = a->elemsize;
    uVar44 = a[1].w;
    uVar3 = a[1].h;
    iVar40 = a[1].d;
    uVar4 = a[1].c;
    pMVar36 = (Mat *)(ulong)uVar4;
    iVar39 = uVar3 * uVar44 * iVar40;
    sVar5 = a[1].elemsize;
    local_148 = sVar26;
    switch(a->dims) {
    case 1:
      if (iVar22 != 1 || uVar53 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003f1334_caseD_1;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [64])c->data;
          if (pauVar31 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar37 = (undefined1 (*) [64])a->data;
              pauVar45 = (undefined1 (*) [64])a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar58 = *pauVar37;
                  uVar43 = uVar44;
                  do {
                    auVar57 = vaddps_avx512f(auVar58,*pauVar45);
                    *pauVar31 = auVar57;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003eec76;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a[1].cstep * (long)pMVar24 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a->w * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140->w * (long)pMVar24 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar3) {
                    auVar58 = *pauVar45;
                    uVar53 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar53 = uVar53 + 1;
                    } while (uVar53 != uVar3);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar40);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_140 = a;
      Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar23 = local_140[1].dims;
      if (iVar23 == 1) {
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
        pauVar31 = (undefined1 (*) [64])c->data;
        if (pauVar31 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar37 = (undefined1 (*) [64])local_140->data;
            pauVar45 = (undefined1 (*) [64])local_140[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar53) {
                auVar58 = *pauVar45;
                uVar44 = uVar53;
                do {
                  auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                  *pauVar31 = auVar57;
                  pauVar37 = pauVar37 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa2b9;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  pauVar31 = (undefined1 (*) [64])
                             (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                  pauVar37 = (undefined1 (*) [64])
                             (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar45 = (undefined1 (*) [64])
                             (local_140->cstep * (long)pMVar24 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      uVar53 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar58 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims != 1) {
          if (local_140[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140[1].w * sVar26 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140->cstep * sVar26 * local_140->elemsize + (long)local_140->data)
                ;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *pauVar45;
                    uVar44 = uVar53;
                    do {
                      auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = c->cstep;
                sVar7 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)pMVar24->data + sVar26 * 0x40);
                pvVar52 = c->data;
                sVar8 = local_140->cstep;
                sVar9 = local_140->elemsize;
                pvVar35 = local_140->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa2b9;
      }
      if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                pvVar52 = c->data;
                sVar7 = a->cstep;
                sVar8 = a->elemsize;
                pvVar35 = a->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) = auVar57
                  ;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                sVar7 = a->cstep;
                pvVar52 = c->data;
                pvVar35 = a[1].data;
                sVar8 = a->elemsize;
                pvVar55 = a->data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar35 + lVar51 * 4)));
                  auVar58 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * uVar27));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 * 4 + sVar26 * sVar5 * uVar27) =
                       auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while ((int)local_150 != (int)lVar51);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_150 = (__m512 *)sVar5;
      if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a->data + a->cstep * (long)pMVar24 * a->elemsize);
                pvVar52 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar28 = 0;
                iVar22 = iVar39;
                do {
                  auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 +
                                                    lVar28 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24) =
                       auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 == uVar53) && (iVar22 == 1)) && (uVar3 == uVar43)) && (uVar42 == 1)) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                pvVar52 = a->data;
                pvVar35 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar52 + lVar51 * 4)));
                  auVar58 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])
                   ((long)pvVar35 + lVar28 * 4 + sVar26 * sVar5 * (long)pMVar24) = auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while (iVar39 != (int)lVar51);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = a[1].cstep;
                sVar5 = a[1].elemsize;
                pvVar52 = a[1].data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a->cstep * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar42 = uVar53;
                    do {
                      auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_138 = pMVar36;
      if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = local_140[1].elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140->cstep * (long)pMVar24 * local_140->elemsize +
                                  (long)local_140->data);
                sVar5 = local_140[1].cstep;
                pvVar52 = local_140[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    lVar28 = 0;
                    do {
                      auVar58 = vaddps_avx512f(*(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24),
                                               *(undefined1 (*) [64])((long)pvVar55 + lVar28));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar53 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->cstep;
                sVar5 = local_140->elemsize;
                pvVar52 = local_140->data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar53 = uVar44;
                    do {
                      auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar53 = uVar53 - 1;
                    } while (uVar53 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                                  (long)local_140[1].data);
                sVar5 = local_140->cstep;
                pvVar52 = local_140->data;
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar28 = 0;
                    do {
                      auVar58 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar55 + lVar28),
                                               *(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar44 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_003fd1ae:
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      local_140 = a;
      goto LAB_003f0701;
    case 4:
      if (a[1].dims != 4) {
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar22 = a[1].dims;
        iVar23 = (int)local_158;
        if (iVar22 != 1) {
          if (iVar22 == 3) {
            if (0 < iVar23) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar45 = (undefined1 (*) [64])
                             (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar53) {
                          auVar58 = *pauVar45;
                          uVar44 = uVar53;
                          do {
                            auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_158);
              return 0;
            }
            return 0;
          }
          if (iVar22 != 2) {
            return 0;
          }
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < iVar30) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar58 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar53;
                      if (0 < (int)uVar53) {
                        do {
                          auVar57 = vaddps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar30);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        pMVar24 = local_138;
        if ((uint)local_160 != 1 || a[1].w != 1) {
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = a->cstep;
                sVar7 = a->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)local_138->data + sVar26 * 0x40);
                pvVar52 = a->data;
                sVar8 = c->cstep;
                sVar9 = c->elemsize;
                pvVar35 = c->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vaddps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa2b9;
      }
      goto LAB_003f0701;
    }
LAB_003f464b:
    a = local_140;
    if (iVar23 != 2) {
      return 0;
    }
LAB_003f0701:
    iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                       (a,pMVar24,c,local_168);
    return iVar22;
  case 1:
    pMVar36 = pMVar24;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
    uVar53 = a->w;
    uVar43 = a->h;
    iVar30 = a->d;
    uVar42 = a->c;
    local_158 = (size_t)uVar42;
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
    sVar26 = a->elemsize;
    uVar44 = a[1].w;
    uVar3 = a[1].h;
    iVar40 = a[1].d;
    uVar4 = a[1].c;
    pMVar36 = (Mat *)(ulong)uVar4;
    iVar39 = uVar3 * uVar44 * iVar40;
    sVar5 = a[1].elemsize;
    local_148 = sVar26;
    switch(a->dims) {
    case 1:
      if (iVar22 != 1 || uVar53 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003f1164_caseD_1;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [64])c->data;
          if (pauVar31 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar37 = (undefined1 (*) [64])a->data;
              pauVar45 = (undefined1 (*) [64])a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar58 = *pauVar37;
                  uVar43 = uVar44;
                  do {
                    auVar57 = vmulps_avx512f(auVar58,*pauVar45);
                    *pauVar31 = auVar57;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003ef130;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a[1].cstep * (long)pMVar24 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a->w * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140->w * (long)pMVar24 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar3) {
                    auVar58 = *pauVar45;
                    uVar53 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar53 = uVar53 + 1;
                    } while (uVar53 != uVar3);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar40);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_140 = a;
      Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar23 = local_140[1].dims;
      if (iVar23 == 1) {
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
        pauVar31 = (undefined1 (*) [64])c->data;
        if (pauVar31 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar37 = (undefined1 (*) [64])local_140->data;
            pauVar45 = (undefined1 (*) [64])local_140[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar53) {
                auVar58 = *pauVar45;
                uVar44 = uVar53;
                do {
                  auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                  *pauVar31 = auVar57;
                  pauVar37 = pauVar37 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa1b3;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  pauVar31 = (undefined1 (*) [64])
                             (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                  pauVar37 = (undefined1 (*) [64])
                             (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar45 = (undefined1 (*) [64])
                             (local_140->cstep * (long)pMVar24 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      uVar53 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar58 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims != 1) {
          if (local_140[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140[1].w * sVar26 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140->cstep * sVar26 * local_140->elemsize + (long)local_140->data)
                ;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *pauVar45;
                    uVar44 = uVar53;
                    do {
                      auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = c->cstep;
                sVar7 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)pMVar24->data + sVar26 * 0x40);
                pvVar52 = c->data;
                sVar8 = local_140->cstep;
                sVar9 = local_140->elemsize;
                pvVar35 = local_140->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa1b3;
      }
      if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                pvVar52 = c->data;
                sVar7 = a->cstep;
                sVar8 = a->elemsize;
                pvVar35 = a->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) = auVar57
                  ;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                sVar7 = a->cstep;
                pvVar52 = c->data;
                pvVar35 = a[1].data;
                sVar8 = a->elemsize;
                pvVar55 = a->data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar35 + lVar51 * 4)));
                  auVar58 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * uVar27));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 * 4 + sVar26 * sVar5 * uVar27) =
                       auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while ((int)local_150 != (int)lVar51);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_150 = (__m512 *)sVar5;
      if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a->data + a->cstep * (long)pMVar24 * a->elemsize);
                pvVar52 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar28 = 0;
                iVar22 = iVar39;
                do {
                  auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 +
                                                    lVar28 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24) =
                       auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar44 == uVar53) && (iVar22 == 1)) && ((uVar3 == uVar43 && (uVar42 == 1)))) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                pvVar52 = a->data;
                pvVar35 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar52 + lVar51 * 4)));
                  auVar58 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])
                   ((long)pvVar35 + lVar28 * 4 + sVar26 * sVar5 * (long)pMVar24) = auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while (iVar39 != (int)lVar51);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = a[1].cstep;
                sVar5 = a[1].elemsize;
                pvVar52 = a[1].data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a->cstep * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar42 = uVar53;
                    do {
                      auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_138 = pMVar36;
      if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = local_140[1].elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140->cstep * (long)pMVar24 * local_140->elemsize +
                                  (long)local_140->data);
                sVar5 = local_140[1].cstep;
                pvVar52 = local_140[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    lVar28 = 0;
                    do {
                      auVar58 = vmulps_avx512f(*(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24),
                                               *(undefined1 (*) [64])((long)pvVar55 + lVar28));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar53 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->cstep;
                sVar5 = local_140->elemsize;
                pvVar52 = local_140->data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar53 = uVar44;
                    do {
                      auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar53 = uVar53 - 1;
                    } while (uVar53 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                                  (long)local_140[1].data);
                sVar5 = local_140->cstep;
                pvVar52 = local_140->data;
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar28 = 0;
                    do {
                      auVar58 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar55 + lVar28),
                                               *(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar44 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_003fd19b:
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      local_140 = a;
      goto LAB_003f0493;
    case 4:
      if (a[1].dims != 4) {
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar22 = a[1].dims;
        iVar23 = (int)local_158;
        if (iVar22 != 1) {
          if (iVar22 == 3) {
            if (0 < iVar23) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar45 = (undefined1 (*) [64])
                             (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar53) {
                          auVar58 = *pauVar45;
                          uVar44 = uVar53;
                          do {
                            auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_158);
              return 0;
            }
            return 0;
          }
          if (iVar22 != 2) {
            return 0;
          }
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < iVar30) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar58 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar53;
                      if (0 < (int)uVar53) {
                        do {
                          auVar57 = vmulps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar30);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        pMVar24 = local_138;
        if ((uint)local_160 != 1 || a[1].w != 1) {
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = a->cstep;
                sVar7 = a->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)local_138->data + sVar26 * 0x40);
                pvVar52 = a->data;
                sVar8 = c->cstep;
                sVar9 = c->elemsize;
                pvVar35 = c->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmulps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa1b3;
      }
      goto LAB_003f0493;
    }
LAB_003f44c0:
    a = local_140;
    if (iVar23 != 2) {
      return 0;
    }
LAB_003f0493:
    iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                       (a,pMVar24,c,local_168);
    return iVar22;
  case 3:
    pMVar36 = pMVar24;
    goto LAB_003eefc7;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
    uVar53 = a->w;
    uVar43 = a->h;
    iVar30 = a->d;
    uVar42 = a->c;
    local_158 = (size_t)uVar42;
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
    sVar26 = a->elemsize;
    uVar44 = a[1].w;
    uVar3 = a[1].h;
    iVar40 = a[1].d;
    uVar4 = a[1].c;
    pMVar36 = (Mat *)(ulong)uVar4;
    iVar39 = uVar3 * uVar44 * iVar40;
    sVar5 = a[1].elemsize;
    local_148 = sVar26;
    switch(a->dims) {
    case 1:
      if (iVar22 != 1 || uVar53 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003f0f94_caseD_1;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [64])c->data;
          if (pauVar31 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar37 = (undefined1 (*) [64])a->data;
              pauVar45 = (undefined1 (*) [64])a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar58 = *pauVar37;
                  uVar43 = uVar44;
                  do {
                    auVar57 = vmaxps_avx512f(auVar58,*pauVar45);
                    *pauVar31 = auVar57;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003ef07c;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a[1].cstep * (long)pMVar24 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a->w * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140->w * (long)pMVar24 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar3) {
                    auVar58 = *pauVar45;
                    uVar53 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar53 = uVar53 + 1;
                    } while (uVar53 != uVar3);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar40);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_140 = a;
      Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar23 = local_140[1].dims;
      if (iVar23 == 1) {
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
        pauVar31 = (undefined1 (*) [64])c->data;
        if (pauVar31 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar37 = (undefined1 (*) [64])local_140->data;
            pauVar45 = (undefined1 (*) [64])local_140[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar53) {
                auVar58 = *pauVar45;
                uVar44 = uVar53;
                do {
                  auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                  *pauVar31 = auVar57;
                  pauVar37 = pauVar37 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa01e;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  pauVar31 = (undefined1 (*) [64])
                             (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                  pauVar37 = (undefined1 (*) [64])
                             (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar45 = (undefined1 (*) [64])
                             (local_140->cstep * (long)pMVar24 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      uVar53 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar58 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims != 1) {
          if (local_140[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140[1].w * sVar26 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140->cstep * sVar26 * local_140->elemsize + (long)local_140->data)
                ;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *pauVar45;
                    uVar44 = uVar53;
                    do {
                      auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = c->cstep;
                sVar7 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)pMVar24->data + sVar26 * 0x40);
                pvVar52 = c->data;
                sVar8 = local_140->cstep;
                sVar9 = local_140->elemsize;
                pvVar35 = local_140->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa01e;
      }
      if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                pvVar52 = c->data;
                sVar7 = a->cstep;
                sVar8 = a->elemsize;
                pvVar35 = a->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) = auVar57
                  ;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                sVar7 = a->cstep;
                pvVar52 = c->data;
                pvVar35 = a[1].data;
                sVar8 = a->elemsize;
                pvVar55 = a->data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar35 + lVar51 * 4);
                  auVar57._4_4_ = uVar1;
                  auVar57._0_4_ = uVar1;
                  auVar57._8_4_ = uVar1;
                  auVar57._12_4_ = uVar1;
                  auVar57._16_4_ = uVar1;
                  auVar57._20_4_ = uVar1;
                  auVar57._24_4_ = uVar1;
                  auVar57._28_4_ = uVar1;
                  auVar57._32_4_ = uVar1;
                  auVar57._36_4_ = uVar1;
                  auVar57._40_4_ = uVar1;
                  auVar57._44_4_ = uVar1;
                  auVar57._48_4_ = uVar1;
                  auVar57._52_4_ = uVar1;
                  auVar57._56_4_ = uVar1;
                  auVar57._60_4_ = uVar1;
                  auVar58 = vmaxps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar55 + lVar28 * 4 + sVar7 * sVar8 * uVar27),
                                           auVar57);
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 * 4 + sVar26 * sVar5 * uVar27) =
                       auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while ((int)local_150 != (int)lVar51);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_150 = (__m512 *)sVar5;
      if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a->data + a->cstep * (long)pMVar24 * a->elemsize);
                pvVar52 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar28 = 0;
                iVar22 = iVar39;
                do {
                  auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 +
                                                    lVar28 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24) =
                       auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 == uVar53) && (iVar22 == 1)) && (uVar3 == uVar43)) && (uVar42 == 1)) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                pvVar52 = a->data;
                pvVar35 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar52 + lVar51 * 4)));
                  auVar58 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])
                   ((long)pvVar35 + lVar28 * 4 + sVar26 * sVar5 * (long)pMVar24) = auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while (iVar39 != (int)lVar51);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = a[1].cstep;
                sVar5 = a[1].elemsize;
                pvVar52 = a[1].data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a->cstep * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar42 = uVar53;
                    do {
                      auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_138 = pMVar36;
      if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = local_140[1].elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140->cstep * (long)pMVar24 * local_140->elemsize +
                                  (long)local_140->data);
                sVar5 = local_140[1].cstep;
                pvVar52 = local_140[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    lVar28 = 0;
                    do {
                      auVar58 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar55 + lVar28),
                                               *(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar53 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->cstep;
                sVar5 = local_140->elemsize;
                pvVar52 = local_140->data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar53 = uVar44;
                    do {
                      auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar53 = uVar53 - 1;
                    } while (uVar53 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                                  (long)local_140[1].data);
                sVar5 = local_140->cstep;
                pvVar52 = local_140->data;
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar28 = 0;
                    do {
                      auVar58 = vmaxps_avx512f(*(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24),
                                               *(undefined1 (*) [64])((long)pvVar55 + lVar28));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar44 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_003fd188:
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      local_140 = a;
      goto LAB_003f0225;
    case 4:
      if (a[1].dims != 4) {
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar22 = a[1].dims;
        iVar23 = (int)local_158;
        if (iVar22 != 1) {
          if (iVar22 == 3) {
            if (0 < iVar23) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar45 = (undefined1 (*) [64])
                             (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar53) {
                          auVar58 = *pauVar45;
                          uVar44 = uVar53;
                          do {
                            auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_158);
              return 0;
            }
            return 0;
          }
          if (iVar22 != 2) {
            return 0;
          }
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < iVar30) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar58 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar53;
                      if (0 < (int)uVar53) {
                        do {
                          auVar57 = vmaxps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar30);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        pMVar24 = local_138;
        if ((uint)local_160 != 1 || a[1].w != 1) {
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = a->cstep;
                sVar7 = a->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)local_138->data + sVar26 * 0x40);
                pvVar52 = a->data;
                sVar8 = c->cstep;
                sVar9 = c->elemsize;
                pvVar35 = c->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vmaxps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa01e;
      }
      goto LAB_003f0225;
    }
LAB_003f3fed:
    a = local_140;
    if (iVar23 != 2) {
      return 0;
    }
LAB_003f0225:
    iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                       (a,pMVar24,c,local_168);
    return iVar22;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
    uVar53 = a->w;
    uVar43 = a->h;
    iVar30 = a->d;
    uVar42 = a->c;
    local_158 = (size_t)uVar42;
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,uVar43 * uVar53 * iVar30);
    sVar26 = a->elemsize;
    uVar44 = a[1].w;
    uVar3 = a[1].h;
    iVar40 = a[1].d;
    uVar4 = a[1].c;
    pMVar36 = (Mat *)(ulong)uVar4;
    iVar39 = uVar3 * uVar44 * iVar40;
    sVar5 = a[1].elemsize;
    local_148 = sVar26;
    switch(a->dims) {
    case 1:
      if (iVar22 != 1 || uVar53 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003f16c2_caseD_1;
        case 2:
          Mat::create(c,uVar44,uVar3,sVar5,iVar23,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [64])c->data;
          if (pauVar31 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar3) {
              pauVar37 = (undefined1 (*) [64])a->data;
              pauVar45 = (undefined1 (*) [64])a[1].data;
              uVar53 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar58 = *pauVar37;
                  uVar43 = uVar44;
                  do {
                    auVar57 = vminps_avx512f(auVar58,*pauVar45);
                    *pauVar31 = auVar57;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar53 = uVar53 + 1;
              } while (uVar53 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar39) {
                  sVar26 = c->cstep;
                  sVar5 = c->elemsize;
                  auVar58 = *(undefined1 (*) [64])((long)a->data + (long)pMVar24 * 0x40);
                  pvVar52 = c->data;
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar28 = 0;
                  iVar22 = iVar39;
                  do {
                    auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                      ((long)pvVar35 +
                                                      lVar28 + sVar7 * sVar8 * (long)pMVar24));
                    *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24)
                         = auVar57;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003ef20c;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a[1].cstep * (long)pMVar24 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a->w * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar57 = vminps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140->w * (long)pMVar24 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar3) {
                    auVar58 = *pauVar45;
                    uVar53 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar57 = vminps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar53 = uVar53 + 1;
                    } while (uVar53 != uVar3);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar40);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_140 = a;
      Mat::create(c,uVar53,uVar43,sVar26,iVar22,pAVar6);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar23 = local_140[1].dims;
      if (iVar23 == 1) {
        Mat::create(c,uVar53,uVar43,sVar26,iVar22,local_168->blob_allocator);
        pauVar31 = (undefined1 (*) [64])c->data;
        if (pauVar31 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar37 = (undefined1 (*) [64])local_140->data;
            pauVar45 = (undefined1 (*) [64])local_140[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar53) {
                auVar58 = *pauVar45;
                uVar44 = uVar53;
                do {
                  auVar57 = vminps_avx512f(auVar58,*pauVar37);
                  *pauVar31 = auVar57;
                  pauVar37 = pauVar37 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa35b;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_140 = a;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar5,iVar23,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)uVar4) {
              pMVar24 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  pauVar31 = (undefined1 (*) [64])
                             (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                  pauVar37 = (undefined1 (*) [64])
                             (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  pauVar45 = (undefined1 (*) [64])
                             (local_140->cstep * (long)pMVar24 * local_140->elemsize +
                             (long)local_140->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar3) {
                      uVar53 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar58 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar57 = vminps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar3);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar40);
                }
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              } while (pMVar24 != pMVar36);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims != 1) {
          if (local_140[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)local_140[1].w * sVar26 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140->cstep * sVar26 * local_140->elemsize + (long)local_140->data)
                ;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *pauVar45;
                    uVar44 = uVar53;
                    do {
                      auVar57 = vminps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        a = local_140;
        if ((uint)local_160 != 1 || local_140[1].w != 1) {
          if (0 < (int)local_158) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = c->cstep;
                sVar7 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)pMVar24->data + sVar26 * 0x40);
                pvVar52 = c->data;
                sVar8 = local_140->cstep;
                sVar9 = local_140->elemsize;
                pvVar35 = local_140->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa35b;
      }
      if (uVar4 == uVar42 && (uVar3 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a[1].data + a[1].cstep * uVar27 * a[1].elemsize);
                pvVar52 = c->data;
                sVar7 = a->cstep;
                sVar8 = a->elemsize;
                pvVar35 = a->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 + lVar28 + sVar7 * sVar8 * uVar27
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * uVar27) = auVar57
                  ;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_158) {
            uVar27 = 0;
            do {
              if (0 < (int)local_150) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                sVar7 = a->cstep;
                pvVar52 = c->data;
                pvVar35 = a[1].data;
                sVar8 = a->elemsize;
                pvVar55 = a->data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar35 + lVar51 * 4);
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  auVar58._32_4_ = uVar1;
                  auVar58._36_4_ = uVar1;
                  auVar58._40_4_ = uVar1;
                  auVar58._44_4_ = uVar1;
                  auVar58._48_4_ = uVar1;
                  auVar58._52_4_ = uVar1;
                  auVar58._56_4_ = uVar1;
                  auVar58._60_4_ = uVar1;
                  auVar58 = vminps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar55 + lVar28 * 4 + sVar7 * sVar8 * uVar27),
                                           auVar58);
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 * 4 + sVar26 * sVar5 * uVar27) =
                       auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while ((int)local_150 != (int)lVar51);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_158);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_150 = (__m512 *)sVar5;
      if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                auVar58 = *(undefined1 (*) [64])
                           ((long)a->data + a->cstep * (long)pMVar24 * a->elemsize);
                pvVar52 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar28 = 0;
                iVar22 = iVar39;
                do {
                  auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar35 +
                                                    lVar28 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])((long)pvVar52 + lVar28 + sVar26 * sVar5 * (long)pMVar24) =
                       auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar44 == uVar53) && (iVar22 == 1)) && ((uVar3 == uVar43 && (uVar42 == 1)))) {
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < iVar39) {
                sVar26 = c->cstep;
                sVar5 = c->elemsize;
                pvVar52 = a->data;
                pvVar35 = c->data;
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar28 = 0;
                lVar51 = 0;
                do {
                  auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar52 + lVar51 * 4)));
                  auVar58 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar55 +
                                                    lVar28 * 4 + sVar7 * sVar8 * (long)pMVar24));
                  *(undefined1 (*) [64])
                   ((long)pvVar35 + lVar28 * 4 + sVar26 * sVar5 * (long)pMVar24) = auVar58;
                  lVar51 = lVar51 + 1;
                  lVar28 = lVar28 + 0x10;
                } while (iVar39 != (int)lVar51);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)uVar4) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = a[1].cstep;
                sVar5 = a[1].elemsize;
                pvVar52 = a[1].data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (a->cstep * (long)pMVar24 * a->elemsize + (long)a->data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar53) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar42 = uVar53;
                    do {
                      auVar57 = vminps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != pMVar36);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_138 = pMVar36;
      if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
        local_140 = a;
        Mat::create(c,uVar53,uVar43,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar26 = local_140[1].elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140->cstep * (long)pMVar24 * local_140->elemsize +
                                  (long)local_140->data);
                sVar5 = local_140[1].cstep;
                pvVar52 = local_140[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar53) {
                    lVar28 = 0;
                    do {
                      auVar58 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar55 + lVar28),
                                               *(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar53 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->cstep;
                sVar5 = local_140->elemsize;
                pvVar52 = local_140->data;
                pauVar31 = (undefined1 (*) [64])
                           (c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pauVar37 = (undefined1 (*) [64])
                           (local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                           (long)local_140[1].data);
                uVar27 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar58 = *(undefined1 (*) [64])
                               ((long)pvVar52 + uVar27 * 0x40 + sVar26 * (long)pMVar24 * sVar5);
                    uVar53 = uVar44;
                    do {
                      auVar57 = vminps_avx512f(auVar58,*pauVar37);
                      *pauVar31 = auVar57;
                      pauVar37 = pauVar37 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar53 = uVar53 - 1;
                    } while (uVar53 != 0);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
        local_140 = a;
        Mat::create(c,uVar44,uVar3,uVar4,sVar5,iVar23,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep != 0) {
          if (0 < (int)local_138) {
            pMVar24 = (Mat *)0x0;
            do {
              if (0 < (int)uVar3) {
                sVar26 = local_140->elemsize;
                pvVar35 = (void *)(c->cstep * (long)pMVar24 * c->elemsize + (long)c->data);
                pvVar55 = (void *)(local_140[1].cstep * (long)pMVar24 * local_140[1].elemsize +
                                  (long)local_140[1].data);
                sVar5 = local_140->cstep;
                pvVar52 = local_140->data;
                uVar53 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar28 = 0;
                    do {
                      auVar58 = vminps_avx512f(*(undefined1 (*) [64])
                                                ((long)pvVar52 +
                                                lVar28 + sVar26 * sVar5 * (long)pMVar24),
                                               *(undefined1 (*) [64])((long)pvVar55 + lVar28));
                      *(undefined1 (*) [64])((long)pvVar35 + lVar28) = auVar58;
                      lVar28 = lVar28 + 0x40;
                    } while ((ulong)uVar44 << 6 != lVar28);
                    pvVar35 = (void *)((long)pvVar35 + lVar28);
                    pvVar55 = (void *)((long)pvVar55 + lVar28);
                  }
                  uVar53 = uVar53 + 1;
                } while (uVar53 != uVar3);
              }
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
            } while (pMVar24 != local_138);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_003fd1d6:
      local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar23);
      local_140 = a;
      goto LAB_003f0b20;
    case 4:
      if (a[1].dims != 4) {
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,iVar30,uVar42,sVar26,iVar22,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar22 = a[1].dims;
        iVar23 = (int)local_158;
        if (iVar22 != 1) {
          if (iVar22 == 3) {
            if (0 < iVar23) {
              sVar26 = 0;
              do {
                if (0 < iVar30) {
                  pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                  pauVar45 = (undefined1 (*) [64])
                             (a[1].cstep * sVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                  iVar22 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar53) {
                          auVar58 = *pauVar45;
                          uVar44 = uVar53;
                          do {
                            auVar57 = vminps_avx512f(auVar58,*pauVar37);
                            *pauVar31 = auVar57;
                            pauVar37 = pauVar37 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
                sVar26 = sVar26 + 1;
              } while (sVar26 != local_158);
              return 0;
            }
            return 0;
          }
          if (iVar22 != 2) {
            return 0;
          }
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < iVar30) {
                pauVar31 = (undefined1 (*) [64])(c->cstep * sVar26 * c->elemsize + (long)c->data);
                pauVar45 = (undefined1 (*) [64])
                           ((long)a[1].w * sVar26 * a[1].elemsize + (long)a[1].data);
                pauVar37 = (undefined1 (*) [64])(a->cstep * sVar26 * a->elemsize + (long)a->data);
                iVar22 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar58 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar53;
                      if (0 < (int)uVar53) {
                        do {
                          auVar57 = vminps_avx512f(auVar58,*pauVar37);
                          *pauVar31 = auVar57;
                          pauVar37 = pauVar37 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar30);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        pMVar24 = local_138;
        if ((uint)local_160 != 1 || a[1].w != 1) {
          if (0 < iVar23) {
            sVar26 = 0;
            do {
              if (0 < (int)local_150) {
                sVar5 = a->cstep;
                sVar7 = a->elemsize;
                auVar58 = *(undefined1 (*) [64])((long)local_138->data + sVar26 * 0x40);
                pvVar52 = a->data;
                sVar8 = c->cstep;
                sVar9 = c->elemsize;
                pvVar35 = c->data;
                lVar28 = 0;
                iVar22 = (int)local_150;
                do {
                  auVar57 = vminps_avx512f(auVar58,*(undefined1 (*) [64])
                                                    ((long)pvVar52 + lVar28 + sVar5 * sVar7 * sVar26
                                                    ));
                  *(undefined1 (*) [64])((long)pvVar35 + lVar28 + sVar8 * sVar9 * sVar26) = auVar57;
                  lVar28 = lVar28 + 0x40;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != local_158);
            return 0;
          }
          return 0;
        }
        goto LAB_003fa35b;
      }
      goto LAB_003f0b20;
    }
LAB_003f4844:
    a = local_140;
    if (iVar23 != 2) {
      return 0;
    }
LAB_003f0b20:
    iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                       (a,pMVar24,c,local_168);
    return iVar22;
  case 6:
    if (a->dims - 1U < 4) {
      uVar53 = a->w;
      local_150 = (__m512 *)(ulong)uVar53;
      uVar43 = a->h;
      local_160 = (__m512 *)(ulong)uVar43;
      iVar30 = a->d;
      uVar42 = a->c;
      local_128 = (ulong)uVar42;
      local_11c = uVar43 * uVar53 * iVar30;
      local_118 = a->elemsize;
      uVar44 = a[1].w;
      uVar27 = (ulong)uVar44;
      uVar3 = a[1].h;
      local_168 = (Option *)(ulong)uVar3;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      local_148 = (ulong)uVar4;
      local_158 = CONCAT44(local_158._4_4_,iVar40);
      local_138 = (Mat *)CONCAT44(local_138._4_4_,uVar3 * uVar44 * iVar40);
      sVar26 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar22 == 1 && uVar53 == 1) {
          local_130 = c;
          iVar22 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                             (a,pMVar24,c,opt);
          return iVar22;
        }
        switch(a[1].dims) {
        case 1:
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar53,local_118,iVar22,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (iVar23 == 1 && local_140[1].w == 1) goto LAB_003f8cf8;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                    (local_140,pMVar24,c,opt);
          break;
        case 2:
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,sVar26,iVar23,opt->blob_allocator);
          puVar33 = (undefined8 *)c->data;
          if (puVar33 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep != 0) {
            if (0 < (int)local_168) {
              local_160 = (__m512 *)local_140->data;
              pafVar46 = (__m512 *)local_140[1].data;
              local_150 = (__m512 *)((ulong)local_150 & 0xffffffff00000000);
              do {
                local_c0[0] = *local_160;
                uVar25 = uVar27;
                if (0 < (int)uVar44) {
                  do {
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,local_c0,&local_100);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    pafVar46 = pafVar46 + 1;
                    puVar33 = puVar33 + 8;
                    uVar53 = (int)uVar25 - 1;
                    uVar25 = (ulong)uVar53;
                  } while (uVar53 != 0);
                }
                local_160 = local_160 + 1;
                iVar22 = (int)local_150 + 1;
                local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar22);
              } while (iVar22 != (int)local_168);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,opt->blob_allocator);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep != 0) {
            if (0 < (int)local_148) {
              local_160 = (__m512 *)0x0;
              do {
                local_c0[0] = *(__m512 *)((long)local_140->data + (long)local_160 * 0x40);
                if (0 < (int)local_138) {
                  lVar51 = local_130->cstep * local_130->elemsize * (long)local_160;
                  pvVar52 = local_130->data;
                  local_168 = (Option *)
                              (local_140[1].cstep * local_140[1].elemsize * (long)local_160 +
                              (long)local_140[1].data);
                  lVar28 = 0;
                  iVar22 = (int)local_138;
                  do {
                    pafVar46 = (__m512 *)((long)local_168 + lVar28);
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,local_c0,&local_100);
                    puVar33 = (undefined8 *)((long)pvVar52 + lVar28 + lVar51);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                local_160 = (__m512 *)((long)local_160 + 1);
              } while (local_160 != (__m512 *)local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar26,iVar23,opt->blob_allocator);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep != 0) {
            if (0 < (int)local_148) {
              local_160 = (__m512 *)0x0;
              do {
                local_c0[0] = *(__m512 *)((long)local_140->data + (long)local_160 * 0x40);
                if (0 < (int)local_138) {
                  lVar51 = local_130->cstep * local_130->elemsize * (long)local_160;
                  pvVar52 = local_130->data;
                  local_168 = (Option *)
                              (local_140[1].cstep * local_140[1].elemsize * (long)local_160 +
                              (long)local_140[1].data);
                  lVar28 = 0;
                  iVar22 = (int)local_138;
                  do {
                    pafVar46 = (__m512 *)((long)local_168 + lVar28);
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,local_c0,&local_100);
                    puVar33 = (undefined8 *)((long)pvVar52 + lVar28 + lVar51);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    lVar28 = lVar28 + 0x40;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                local_160 = (__m512 *)((long)local_160 + 1);
              } while (local_160 != (__m512 *)local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,pAVar6);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep != 0) {
            if (0 < (int)local_148) {
              local_158 = 0;
              pOVar29 = local_168;
              do {
                if (0 < (int)pOVar29) {
                  puVar33 = (undefined8 *)
                            (local_130->cstep * local_158 * local_130->elemsize +
                            (long)local_130->data);
                  pafVar46 = (__m512 *)
                             (local_140[1].cstep * local_158 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  local_160 = (__m512 *)
                              ((long)local_140->w * local_158 * local_140->elemsize +
                              (long)local_140->data);
                  iVar22 = 0;
                  do {
                    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar22);
                    local_c0[0] = *local_160;
                    uVar25 = uVar27;
                    if (0 < (int)uVar44) {
                      do {
                        uVar60 = *(undefined8 *)*pafVar46;
                        uVar67 = *(undefined8 *)(*pafVar46 + 2);
                        uVar68 = *(undefined8 *)(*pafVar46 + 4);
                        uVar69 = *(undefined8 *)(*pafVar46 + 6);
                        uVar70 = *(undefined8 *)(*pafVar46 + 8);
                        uVar71 = *(undefined8 *)(*pafVar46 + 10);
                        uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                        uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                        local_100 = *pafVar46;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                  (&local_169,local_c0,&local_100);
                        *puVar33 = uVar60;
                        puVar33[1] = uVar67;
                        puVar33[2] = uVar68;
                        puVar33[3] = uVar69;
                        puVar33[4] = uVar70;
                        puVar33[5] = uVar71;
                        puVar33[6] = uVar72;
                        puVar33[7] = uVar73;
                        pafVar46 = pafVar46 + 1;
                        puVar33 = puVar33 + 8;
                        uVar53 = (int)uVar25 - 1;
                        uVar25 = (ulong)uVar53;
                      } while (uVar53 != 0);
                    }
                    local_160 = local_160 + 1;
                    iVar22 = (int)local_150 + 1;
                    pOVar29 = local_168;
                  } while (iVar22 != (int)local_168);
                }
                local_158 = local_158 + 1;
              } while (local_158 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar26,iVar23,pAVar6);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep != 0) {
            if (0 < (int)local_148) {
              local_128 = 0;
              pOVar29 = local_168;
              do {
                if (0 < (int)local_158) {
                  puVar33 = (undefined8 *)
                            (local_130->cstep * local_128 * local_130->elemsize +
                            (long)local_130->data);
                  pafVar46 = (__m512 *)
                             (local_140[1].cstep * local_128 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  local_150 = (__m512 *)
                              ((long)local_140->w * local_128 * local_140->elemsize +
                              (long)local_140->data);
                  iVar22 = 0;
                  do {
                    local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                    local_c0[0] = *local_150;
                    if (0 < (int)pOVar29) {
                      iVar22 = 0;
                      do {
                        local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar22);
                        uVar25 = uVar27;
                        if (0 < (int)uVar44) {
                          do {
                            uVar60 = *(undefined8 *)*pafVar46;
                            uVar67 = *(undefined8 *)(*pafVar46 + 2);
                            uVar68 = *(undefined8 *)(*pafVar46 + 4);
                            uVar69 = *(undefined8 *)(*pafVar46 + 6);
                            uVar70 = *(undefined8 *)(*pafVar46 + 8);
                            uVar71 = *(undefined8 *)(*pafVar46 + 10);
                            uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                            uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                            local_100 = *pafVar46;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                      (&local_169,local_c0,&local_100);
                            *puVar33 = uVar60;
                            puVar33[1] = uVar67;
                            puVar33[2] = uVar68;
                            puVar33[3] = uVar69;
                            puVar33[4] = uVar70;
                            puVar33[5] = uVar71;
                            puVar33[6] = uVar72;
                            puVar33[7] = uVar73;
                            pafVar46 = pafVar46 + 1;
                            puVar33 = puVar33 + 8;
                            uVar53 = (int)uVar25 - 1;
                            uVar25 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        iVar22 = (uint)local_160 + 1;
                        pOVar29 = local_168;
                      } while (iVar22 != (int)local_168);
                    }
                    local_150 = local_150 + 1;
                    iVar22 = (int)local_138 + 1;
                  } while (iVar22 != (int)local_158);
                }
                local_128 = local_128 + 1;
              } while (local_128 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_130 = c;
        Mat::create(c,uVar53,uVar43,local_118,iVar22,pAVar6);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims == 1) {
          Mat::create(c,(int)local_150,(int)local_160,local_118,iVar22,opt->blob_allocator);
          puVar33 = (undefined8 *)c->data;
          if (puVar33 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (iVar23 != 1 || local_140[1].w != 1) {
            if (0 < (int)(uint)local_160) {
              pafVar46 = (__m512 *)local_140->data;
              local_178 = (__m512 *)local_140[1].data;
              local_168 = (Option *)((ulong)local_168 & 0xffffffff00000000);
              do {
                local_c0[0] = *local_178;
                uVar27 = (ulong)local_150 & 0xffffffff;
                if (0 < (int)local_150) {
                  do {
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,&local_100,local_c0);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    pafVar46 = pafVar46 + 1;
                    puVar33 = puVar33 + 8;
                    uVar53 = (int)uVar27 - 1;
                    uVar27 = (ulong)uVar53;
                  } while (uVar53 != 0);
                }
                local_178 = local_178 + 1;
                iVar22 = (int)local_168 + 1;
                local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
              } while (iVar22 != (uint)local_160);
              return 0;
            }
            return 0;
          }
LAB_003f8cf8:
          iVar22 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                             (local_140,pMVar24,c,opt);
          return iVar22;
        }
        a = local_140;
        if (local_140[1].dims != 2) {
          return 0;
        }
LAB_003efe00:
        iVar22 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,pMVar24,c,opt);
        return iVar22;
      case 3:
        local_108 = sVar26;
        if (a[1].dims == 3) {
          if (uVar4 == uVar42 && (uVar3 == 1 && uVar44 == 1)) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar53,uVar43,uVar42,local_118,iVar22,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_128) {
                local_160 = (__m512 *)0x0;
                do {
                  pvVar52 = local_140->data;
                  local_c0[0] = *(__m512 *)
                                 ((long)local_140[1].data +
                                 local_140[1].cstep * (long)local_160 * local_140[1].elemsize);
                  if (0 < (int)local_11c) {
                    local_168 = (Option *)
                                ((long)local_130->data +
                                local_130->cstep * local_130->elemsize * (long)local_160);
                    lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                    lVar51 = 0;
                    uVar53 = local_11c;
                    do {
                      pafVar46 = (__m512 *)((long)pvVar52 + lVar51 + lVar28);
                      uVar60 = *(undefined8 *)*pafVar46;
                      uVar67 = *(undefined8 *)(*pafVar46 + 2);
                      uVar68 = *(undefined8 *)(*pafVar46 + 4);
                      uVar69 = *(undefined8 *)(*pafVar46 + 6);
                      uVar70 = *(undefined8 *)(*pafVar46 + 8);
                      uVar71 = *(undefined8 *)(*pafVar46 + 10);
                      uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                      uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                      local_100 = *pafVar46;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_169,&local_100,local_c0);
                      puVar33 = (undefined8 *)((long)local_168 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      puVar33[4] = uVar70;
                      puVar33[5] = uVar71;
                      puVar33[6] = uVar72;
                      puVar33[7] = uVar73;
                      lVar51 = lVar51 + 0x40;
                      uVar53 = uVar53 - 1;
                    } while (uVar53 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_158 = CONCAT44(local_158._4_4_,uVar44) ^ 1;
          if ((uVar44 == uVar53) && (iVar23 == 1 && (uVar4 == 1 && uVar3 == uVar43))) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar53,uVar43,uVar42,local_118,iVar22,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_128) {
                local_150 = (__m512 *)(ulong)local_11c;
                local_158 = 0;
                do {
                  if (0 < (int)local_11c) {
                    lVar28 = local_130->cstep * local_130->elemsize * local_158;
                    pvVar52 = local_130->data;
                    local_160 = (__m512 *)local_140[1].data;
                    local_168 = (Option *)
                                (local_140->cstep * local_140->elemsize * local_158 +
                                (long)local_140->data);
                    lVar54 = 0;
                    lVar51 = 0;
                    do {
                      local_c0[0] = *(__m512 *)((long)local_168 + lVar54 * 4);
                      afVar59 = (__m512)vbroadcastss_avx512f
                                                  (ZEXT416(*(uint *)((long)local_160 + lVar51 * 4)))
                      ;
                      local_100 = afVar59;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_169,local_c0,&local_100);
                      *(__m512 *)((long)pvVar52 + lVar54 * 4 + lVar28) = afVar59;
                      lVar51 = lVar51 + 1;
                      lVar54 = lVar54 + 0x10;
                    } while ((int)local_150 != (int)lVar51);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar43 == 1 && (uVar53 ^ 1) == 0) && uVar42 == uVar4) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_160 = (__m512 *)0x0;
                do {
                  pvVar52 = local_140[1].data;
                  local_c0[0] = *(__m512 *)
                                 ((long)local_140->data +
                                 local_140->cstep * (long)local_160 * local_140->elemsize);
                  if (0 < (int)local_138) {
                    local_168 = (Option *)
                                ((long)local_130->data +
                                local_130->cstep * local_130->elemsize * (long)local_160);
                    lVar28 = local_140[1].cstep * local_140[1].elemsize * (long)local_160;
                    lVar51 = 0;
                    iVar22 = (int)local_138;
                    do {
                      pafVar46 = (__m512 *)((long)pvVar52 + lVar51 + lVar28);
                      uVar60 = *(undefined8 *)*pafVar46;
                      uVar67 = *(undefined8 *)(*pafVar46 + 2);
                      uVar68 = *(undefined8 *)(*pafVar46 + 4);
                      uVar69 = *(undefined8 *)(*pafVar46 + 6);
                      uVar70 = *(undefined8 *)(*pafVar46 + 8);
                      uVar71 = *(undefined8 *)(*pafVar46 + 10);
                      uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                      uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                      local_100 = *pafVar46;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_169,local_c0,&local_100);
                      puVar33 = (undefined8 *)((long)local_168 + lVar51);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      puVar33[4] = uVar70;
                      puVar33[5] = uVar71;
                      puVar33[6] = uVar72;
                      puVar33[7] = uVar73;
                      lVar51 = lVar51 + 0x40;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  local_160 = (__m512 *)((long)local_160 + 1);
                } while (local_160 != (__m512 *)local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar44 == uVar53) && (iVar22 == 1)) && (uVar3 == uVar43)) && (uVar42 == 1)) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_150 = (__m512 *)((ulong)local_138 & 0xffffffff);
                local_158 = 0;
                do {
                  if (0 < (int)local_138) {
                    local_168 = (Option *)local_140->data;
                    lVar28 = local_130->cstep * local_130->elemsize * local_158;
                    pvVar52 = local_130->data;
                    local_160 = (__m512 *)
                                (local_140[1].cstep * local_140[1].elemsize * local_158 +
                                (long)local_140[1].data);
                    lVar54 = 0;
                    lVar51 = 0;
                    do {
                      local_c0[0] = (__m512)vbroadcastss_avx512f
                                                      (ZEXT416(*(uint *)((long)local_168 +
                                                                        lVar51 * 4)));
                      pafVar46 = (__m512 *)((long)local_160 + lVar54 * 4);
                      uVar60 = *(undefined8 *)*pafVar46;
                      uVar67 = *(undefined8 *)(*pafVar46 + 2);
                      uVar68 = *(undefined8 *)(*pafVar46 + 4);
                      uVar69 = *(undefined8 *)(*pafVar46 + 6);
                      uVar70 = *(undefined8 *)(*pafVar46 + 8);
                      uVar71 = *(undefined8 *)(*pafVar46 + 10);
                      uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                      uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                      local_100 = *pafVar46;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_169,local_c0,&local_100);
                      puVar33 = (undefined8 *)((long)pvVar52 + lVar54 * 4 + lVar28);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      puVar33[4] = uVar70;
                      puVar33[5] = uVar71;
                      puVar33[6] = uVar72;
                      puVar33[7] = uVar73;
                      lVar51 = lVar51 + 1;
                      lVar54 = lVar54 + 0x10;
                    } while ((int)local_150 != (int)lVar51);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((int)local_158 == 0 && uVar3 == uVar43) && uVar42 == uVar4) && uVar53 != 1) {
            local_140 = a;
            local_130 = c;
            Mat::create(c,uVar53,uVar43,uVar42,local_118,iVar22,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_158 = 0;
                do {
                  if (0 < (int)(uint)local_160) {
                    local_168 = (Option *)
                                (local_140[1].cstep * local_158 * local_140[1].elemsize +
                                (long)local_140[1].data);
                    puVar33 = (undefined8 *)
                              (local_130->cstep * local_158 * local_130->elemsize +
                              (long)local_130->data);
                    pafVar46 = (__m512 *)
                               (local_140->cstep * local_158 * local_140->elemsize +
                               (long)local_140->data);
                    uVar27 = 0;
                    do {
                      local_c0[0] = *(__m512 *)((long)local_168 + uVar27 * 0x40);
                      uVar25 = (ulong)local_150 & 0xffffffff;
                      if (0 < (int)local_150) {
                        do {
                          uVar60 = *(undefined8 *)*pafVar46;
                          uVar67 = *(undefined8 *)(*pafVar46 + 2);
                          uVar68 = *(undefined8 *)(*pafVar46 + 4);
                          uVar69 = *(undefined8 *)(*pafVar46 + 6);
                          uVar70 = *(undefined8 *)(*pafVar46 + 8);
                          uVar71 = *(undefined8 *)(*pafVar46 + 10);
                          uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                          local_100 = *pafVar46;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,&local_100,local_c0);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          pafVar46 = pafVar46 + 1;
                          puVar33 = puVar33 + 8;
                          uVar53 = (int)uVar25 - 1;
                          uVar25 = (ulong)uVar53;
                        } while (uVar53 != 0);
                      }
                      uVar27 = uVar27 + 1;
                    } while ((__m512 *)uVar27 != local_160);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar3 == 1 && (uVar44 ^ uVar53) == 0) && uVar4 == uVar42) && uVar43 != 1) {
            local_140 = a;
            local_138 = pMVar24;
            local_130 = c;
            Mat::create(c,uVar53,uVar43,uVar42,local_118,iVar22,opt->blob_allocator);
            if (local_130->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                lVar28 = (long)local_150 << 6;
                local_158 = 0;
                local_168 = (Option *)lVar28;
                do {
                  if (0 < (int)local_160) {
                    pvVar35 = (void *)(local_130->cstep * local_158 * local_130->elemsize +
                                      (long)local_130->data);
                    pvVar55 = (void *)(local_140->cstep * local_158 * local_140->elemsize +
                                      (long)local_140->data);
                    lVar51 = local_140[1].elemsize * local_140[1].cstep * local_158;
                    pvVar52 = local_140[1].data;
                    iVar22 = 0;
                    pafVar46 = local_160;
                    do {
                      if (0 < (int)local_150) {
                        lVar54 = 0;
                        do {
                          local_c0[0] = *(__m512 *)((long)pvVar55 + lVar54);
                          pafVar46 = (__m512 *)((long)pvVar52 + lVar54 + lVar51);
                          uVar60 = *(undefined8 *)*pafVar46;
                          uVar67 = *(undefined8 *)(*pafVar46 + 2);
                          uVar68 = *(undefined8 *)(*pafVar46 + 4);
                          uVar69 = *(undefined8 *)(*pafVar46 + 6);
                          uVar70 = *(undefined8 *)(*pafVar46 + 8);
                          uVar71 = *(undefined8 *)(*pafVar46 + 10);
                          uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                          local_100 = *pafVar46;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,local_c0,&local_100);
                          puVar33 = (undefined8 *)((long)pvVar35 + lVar54);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          lVar54 = lVar54 + 0x40;
                        } while (lVar28 != lVar54);
                        pvVar35 = (void *)((long)pvVar35 + lVar54);
                        pvVar55 = (void *)((long)pvVar55 + lVar54);
                        pafVar46 = local_160;
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != (int)pafVar46);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar53 ^ 1) == 0 && uVar43 == uVar3) && uVar4 == uVar42) && uVar44 != 1) {
            local_140 = a;
            local_138 = pMVar24;
            local_130 = c;
            Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_158 = 0;
                pOVar29 = local_168;
                do {
                  if (0 < (int)pOVar29) {
                    local_150 = (__m512 *)
                                (local_140->cstep * local_158 * local_140->elemsize +
                                (long)local_140->data);
                    puVar33 = (undefined8 *)
                              (local_130->cstep * local_158 * local_130->elemsize +
                              (long)local_130->data);
                    pafVar46 = (__m512 *)
                               (local_140[1].cstep * local_158 * local_140[1].elemsize +
                               (long)local_140[1].data);
                    local_160 = (__m512 *)0x0;
                    do {
                      local_c0[0] = *(__m512 *)((long)local_150 + (long)local_160 * 0x40);
                      uVar25 = uVar27;
                      if (0 < (int)uVar44) {
                        do {
                          uVar60 = *(undefined8 *)*pafVar46;
                          uVar67 = *(undefined8 *)(*pafVar46 + 2);
                          uVar68 = *(undefined8 *)(*pafVar46 + 4);
                          uVar69 = *(undefined8 *)(*pafVar46 + 6);
                          uVar70 = *(undefined8 *)(*pafVar46 + 8);
                          uVar71 = *(undefined8 *)(*pafVar46 + 10);
                          uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                          local_100 = *pafVar46;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,local_c0,&local_100);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          pafVar46 = pafVar46 + 1;
                          puVar33 = puVar33 + 8;
                          uVar53 = (int)uVar25 - 1;
                          uVar25 = (ulong)uVar53;
                        } while (uVar53 != 0);
                      }
                      local_160 = (__m512 *)((long)local_160 + 1);
                      pOVar29 = local_168;
                    } while ((Option *)local_160 != local_168);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_140 = a;
          local_138 = pMVar24;
          local_130 = c;
          if ((((uVar44 ^ uVar53) == 0 && uVar43 == 1) && uVar42 == uVar4) && uVar3 != 1) {
            Mat::create(c,uVar44,uVar3,uVar4,sVar26,iVar23,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_130->c * local_130->cstep != 0) {
              if (0 < (int)local_148) {
                local_158 = 0;
                pOVar29 = local_168;
                local_150 = (__m512 *)(uVar27 << 6);
                do {
                  if (0 < (int)pOVar29) {
                    pvVar55 = (void *)(local_130->cstep * local_158 * local_130->elemsize +
                                      (long)local_130->data);
                    pvVar35 = (void *)(local_140[1].cstep * local_158 * local_140[1].elemsize +
                                      (long)local_140[1].data);
                    lVar28 = local_140->elemsize * local_140->cstep * local_158;
                    pvVar52 = local_140->data;
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar44) {
                        local_160 = (__m512 *)CONCAT44(local_160._4_4_,iVar22);
                        lVar51 = 0;
                        do {
                          local_c0[0] = *(__m512 *)((long)pvVar52 + lVar51 + lVar28);
                          pafVar46 = (__m512 *)((long)pvVar35 + lVar51);
                          uVar60 = *(undefined8 *)*pafVar46;
                          uVar67 = *(undefined8 *)(*pafVar46 + 2);
                          uVar68 = *(undefined8 *)(*pafVar46 + 4);
                          uVar69 = *(undefined8 *)(*pafVar46 + 6);
                          uVar70 = *(undefined8 *)(*pafVar46 + 8);
                          uVar71 = *(undefined8 *)(*pafVar46 + 10);
                          uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                          local_100 = *pafVar46;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,local_c0,&local_100);
                          puVar33 = (undefined8 *)((long)pvVar55 + lVar51);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          lVar51 = lVar51 + 0x40;
                        } while (uVar27 << 6 != lVar51);
                        pvVar55 = (void *)((long)pvVar55 + lVar51);
                        pvVar35 = (void *)((long)pvVar35 + lVar51);
                        pOVar29 = local_168;
                        iVar22 = (uint)local_160;
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != (int)pOVar29);
                  }
                  local_158 = local_158 + 1;
                } while (local_158 != local_148);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003efe00;
        }
        if (a[1].dims == 4) {
          local_140 = a;
          local_130 = c;
          Mat::create(c,uVar44,uVar3,iVar40,uVar4,sVar26,iVar23,opt->blob_allocator);
          if (local_130->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_130->c * local_130->cstep != 0) {
            if (0 < (int)local_148) {
              local_128 = 0;
              pOVar29 = local_168;
              do {
                if (0 < (int)local_158) {
                  puVar33 = (undefined8 *)
                            (local_130->cstep * local_128 * local_130->elemsize +
                            (long)local_130->data);
                  pafVar46 = (__m512 *)
                             (local_140[1].cstep * local_128 * local_140[1].elemsize +
                             (long)local_140[1].data);
                  local_160 = (__m512 *)
                              (local_140->cstep * local_128 * local_140->elemsize +
                              (long)local_140->data);
                  iVar22 = 0;
                  do {
                    local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                    if (0 < (int)pOVar29) {
                      iVar22 = 0;
                      do {
                        local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar22);
                        local_c0[0] = *local_160;
                        uVar25 = uVar27;
                        if (0 < (int)uVar44) {
                          do {
                            uVar60 = *(undefined8 *)*pafVar46;
                            uVar67 = *(undefined8 *)(*pafVar46 + 2);
                            uVar68 = *(undefined8 *)(*pafVar46 + 4);
                            uVar69 = *(undefined8 *)(*pafVar46 + 6);
                            uVar70 = *(undefined8 *)(*pafVar46 + 8);
                            uVar71 = *(undefined8 *)(*pafVar46 + 10);
                            uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                            uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                            local_100 = *pafVar46;
                            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                      (&local_169,local_c0,&local_100);
                            *puVar33 = uVar60;
                            puVar33[1] = uVar67;
                            puVar33[2] = uVar68;
                            puVar33[3] = uVar69;
                            puVar33[4] = uVar70;
                            puVar33[5] = uVar71;
                            puVar33[6] = uVar72;
                            puVar33[7] = uVar73;
                            pafVar46 = pafVar46 + 1;
                            puVar33 = puVar33 + 8;
                            uVar53 = (int)uVar25 - 1;
                            uVar25 = (ulong)uVar53;
                          } while (uVar53 != 0);
                        }
                        local_160 = local_160 + 1;
                        iVar22 = (int)local_150 + 1;
                        pOVar29 = local_168;
                      } while (iVar22 != (int)local_168);
                    }
                    iVar22 = (int)local_138 + 1;
                  } while (iVar22 != (int)local_158);
                }
                local_128 = local_128 + 1;
              } while (local_128 != local_148);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_140 = a;
        local_130 = c;
        Mat::create(c,uVar53,uVar43,uVar42,local_118,iVar22,opt->blob_allocator);
        if (local_130->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_130->c * local_130->cstep == 0) {
          return -100;
        }
        if (local_140[1].dims == 1) {
          c = local_130;
          if (iVar23 != 1 || local_140[1].w != 1) {
            if (0 < (int)local_128) {
              local_160 = (__m512 *)0x0;
              do {
                pvVar52 = local_140->data;
                local_c0[0] = *(__m512 *)((long)local_140[1].data + (long)local_160 * 0x40);
                if (0 < (int)local_11c) {
                  local_168 = (Option *)
                              (local_130->cstep * local_130->elemsize * (long)local_160 +
                              (long)local_130->data);
                  lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                  lVar51 = 0;
                  uVar53 = local_11c;
                  do {
                    pafVar46 = (__m512 *)((long)pvVar52 + lVar51 + lVar28);
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,&local_100,local_c0);
                    puVar33 = (undefined8 *)((long)local_168 + lVar51);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    lVar51 = lVar51 + 0x40;
                    uVar53 = uVar53 - 1;
                  } while (uVar53 != 0);
                }
                local_160 = (__m512 *)((long)local_160 + 1);
              } while (local_160 != (__m512 *)local_128);
              return 0;
            }
            return 0;
          }
          goto LAB_003f8cf8;
        }
        if (local_140[1].dims == 2) {
          if (0 < (int)local_128) {
            local_158 = 0;
            do {
              if (0 < (int)(uint)local_160) {
                puVar33 = (undefined8 *)
                          (local_130->cstep * local_158 * local_130->elemsize +
                          (long)local_130->data);
                pafVar46 = (__m512 *)
                           ((long)local_140[1].w * local_158 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pafVar47 = (__m512 *)
                           (local_140->cstep * local_158 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                do {
                  local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
                  local_c0[0] = *pafVar46;
                  uVar27 = (ulong)local_150 & 0xffffffff;
                  if (0 < (int)local_150) {
                    do {
                      uVar60 = *(undefined8 *)*pafVar47;
                      uVar67 = *(undefined8 *)(*pafVar47 + 2);
                      uVar68 = *(undefined8 *)(*pafVar47 + 4);
                      uVar69 = *(undefined8 *)(*pafVar47 + 6);
                      uVar70 = *(undefined8 *)(*pafVar47 + 8);
                      uVar71 = *(undefined8 *)(*pafVar47 + 10);
                      uVar72 = *(undefined8 *)(*pafVar47 + 0xc);
                      uVar73 = *(undefined8 *)(*pafVar47 + 0xe);
                      local_100 = *pafVar47;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_169,&local_100,local_c0);
                      *puVar33 = uVar60;
                      puVar33[1] = uVar67;
                      puVar33[2] = uVar68;
                      puVar33[3] = uVar69;
                      puVar33[4] = uVar70;
                      puVar33[5] = uVar71;
                      puVar33[6] = uVar72;
                      puVar33[7] = uVar73;
                      pafVar47 = pafVar47 + 1;
                      puVar33 = puVar33 + 8;
                      uVar53 = (int)uVar27 - 1;
                      uVar27 = (ulong)uVar53;
                    } while (uVar53 != 0);
                  }
                  pafVar46 = pafVar46 + 1;
                  iVar22 = (int)local_168 + 1;
                } while (iVar22 != (uint)local_160);
              }
              local_158 = local_158 + 1;
            } while (local_158 != local_128);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        local_130 = c;
        if (a[1].dims == 4) goto LAB_003efe00;
        local_158 = CONCAT44(local_158._4_4_,iVar30);
        local_140 = a;
        local_138 = pMVar24;
        Mat::create(c,uVar53,uVar43,iVar30,uVar42,local_118,iVar22,opt->blob_allocator);
        if (local_130->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_130->c * local_130->cstep == 0) {
          return -100;
        }
        iVar22 = local_140[1].dims;
        iVar30 = (int)local_128;
        if (iVar22 == 1) {
          c = local_130;
          pMVar24 = local_138;
          if (iVar23 != 1 || local_140[1].w != 1) {
            if (0 < iVar30) {
              local_160 = (__m512 *)0x0;
              do {
                pvVar52 = local_140->data;
                local_c0[0] = *(__m512 *)((long)local_140[1].data + (long)local_160 * 0x40);
                if (0 < (int)local_11c) {
                  lVar28 = local_140->cstep * local_140->elemsize * (long)local_160;
                  local_168 = (Option *)
                              (local_130->cstep * local_130->elemsize * (long)local_160 +
                              (long)local_130->data);
                  lVar51 = 0;
                  uVar53 = local_11c;
                  do {
                    pafVar46 = (__m512 *)((long)pvVar52 + lVar51 + lVar28);
                    uVar60 = *(undefined8 *)*pafVar46;
                    uVar67 = *(undefined8 *)(*pafVar46 + 2);
                    uVar68 = *(undefined8 *)(*pafVar46 + 4);
                    uVar69 = *(undefined8 *)(*pafVar46 + 6);
                    uVar70 = *(undefined8 *)(*pafVar46 + 8);
                    uVar71 = *(undefined8 *)(*pafVar46 + 10);
                    uVar72 = *(undefined8 *)(*pafVar46 + 0xc);
                    uVar73 = *(undefined8 *)(*pafVar46 + 0xe);
                    local_100 = *pafVar46;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_169,&local_100,local_c0);
                    puVar33 = (undefined8 *)((long)local_168 + lVar51);
                    *puVar33 = uVar60;
                    puVar33[1] = uVar67;
                    puVar33[2] = uVar68;
                    puVar33[3] = uVar69;
                    puVar33[4] = uVar70;
                    puVar33[5] = uVar71;
                    puVar33[6] = uVar72;
                    puVar33[7] = uVar73;
                    lVar51 = lVar51 + 0x40;
                    uVar53 = uVar53 - 1;
                  } while (uVar53 != 0);
                }
                local_160 = (__m512 *)((long)local_160 + 1);
              } while (local_160 != (__m512 *)local_128);
              return 0;
            }
            return 0;
          }
          goto LAB_003f8cf8;
        }
        if (iVar22 == 3) {
          if (0 < iVar30) {
            local_148 = 0;
            do {
              if (0 < (int)local_158) {
                puVar33 = (undefined8 *)
                          (local_130->cstep * local_148 * local_130->elemsize +
                          (long)local_130->data);
                pafVar47 = (__m512 *)
                           (local_140[1].cstep * local_148 * local_140[1].elemsize +
                           (long)local_140[1].data);
                pafVar48 = (__m512 *)
                           (local_140->cstep * local_148 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                pafVar46 = local_160;
                do {
                  local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                  if (0 < (int)pafVar46) {
                    iVar22 = 0;
                    do {
                      local_168 = (Option *)CONCAT44(local_168._4_4_,iVar22);
                      local_c0[0] = *pafVar47;
                      uVar27 = (ulong)local_150 & 0xffffffff;
                      if (0 < (int)local_150) {
                        do {
                          uVar60 = *(undefined8 *)*pafVar48;
                          uVar67 = *(undefined8 *)(*pafVar48 + 2);
                          uVar68 = *(undefined8 *)(*pafVar48 + 4);
                          uVar69 = *(undefined8 *)(*pafVar48 + 6);
                          uVar70 = *(undefined8 *)(*pafVar48 + 8);
                          uVar71 = *(undefined8 *)(*pafVar48 + 10);
                          uVar72 = *(undefined8 *)(*pafVar48 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar48 + 0xe);
                          local_100 = *pafVar48;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,&local_100,local_c0);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          pafVar48 = pafVar48 + 1;
                          puVar33 = puVar33 + 8;
                          uVar53 = (int)uVar27 - 1;
                          uVar27 = (ulong)uVar53;
                        } while (uVar53 != 0);
                      }
                      pafVar47 = pafVar47 + 1;
                      iVar22 = (int)local_168 + 1;
                      pafVar46 = local_160;
                    } while (iVar22 != (int)local_160);
                  }
                  iVar22 = (int)local_138 + 1;
                } while (iVar22 != (int)local_158);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_128);
            return 0;
          }
          return 0;
        }
        if (iVar22 == 2) {
          if (0 < iVar30) {
            local_148 = 0;
            do {
              if (0 < (int)local_158) {
                puVar33 = (undefined8 *)
                          (local_130->cstep * local_148 * local_130->elemsize +
                          (long)local_130->data);
                local_168 = (Option *)
                            ((long)local_140[1].w * local_148 * local_140[1].elemsize +
                            (long)local_140[1].data);
                pafVar47 = (__m512 *)
                           (local_140->cstep * local_148 * local_140->elemsize +
                           (long)local_140->data);
                iVar22 = 0;
                pafVar46 = local_160;
                do {
                  local_138 = (Mat *)CONCAT44(local_138._4_4_,iVar22);
                  local_c0[0] = *(__m512 *)local_168;
                  if (0 < (int)pafVar46) {
                    iVar22 = 0;
                    do {
                      uVar27 = (ulong)local_150 & 0xffffffff;
                      if (0 < (int)local_150) {
                        do {
                          uVar60 = *(undefined8 *)*pafVar47;
                          uVar67 = *(undefined8 *)(*pafVar47 + 2);
                          uVar68 = *(undefined8 *)(*pafVar47 + 4);
                          uVar69 = *(undefined8 *)(*pafVar47 + 6);
                          uVar70 = *(undefined8 *)(*pafVar47 + 8);
                          uVar71 = *(undefined8 *)(*pafVar47 + 10);
                          uVar72 = *(undefined8 *)(*pafVar47 + 0xc);
                          uVar73 = *(undefined8 *)(*pafVar47 + 0xe);
                          local_100 = *pafVar47;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                    (&local_169,&local_100,local_c0);
                          *puVar33 = uVar60;
                          puVar33[1] = uVar67;
                          puVar33[2] = uVar68;
                          puVar33[3] = uVar69;
                          puVar33[4] = uVar70;
                          puVar33[5] = uVar71;
                          puVar33[6] = uVar72;
                          puVar33[7] = uVar73;
                          pafVar47 = pafVar47 + 1;
                          puVar33 = puVar33 + 8;
                          uVar53 = (int)uVar27 - 1;
                          uVar27 = (ulong)uVar53;
                        } while (uVar53 != 0);
                      }
                      iVar22 = iVar22 + 1;
                      pafVar46 = local_160;
                    } while (iVar22 != (int)local_160);
                  }
                  local_168 = local_168 + 1;
                  iVar22 = (int)local_138 + 1;
                } while (iVar22 != (int)local_158);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_128);
            return 0;
          }
          return 0;
        }
      }
    }
    return 0;
  case 7:
    pMVar36 = a;
    a = pMVar24;
    break;
  case 8:
    pMVar36 = a;
    a = pMVar24;
LAB_003eefc7:
    iVar22 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar36,c,opt);
    return iVar22;
  default:
    goto switchD_003eeaf0_default;
  }
  iVar22 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar36,c,opt);
  return iVar22;
switchD_003f16c2_caseD_1:
  Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  if ((uint)local_160 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>(a,pMVar24,c,local_168);
    return 0;
  }
  goto LAB_003fa35b;
switchD_003f0f94_caseD_1:
  Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  if ((uint)local_160 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>(a,pMVar24,c,local_168);
    return 0;
  }
  goto LAB_003fa01e;
switchD_003f1164_caseD_1:
  Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  if ((uint)local_160 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>(a,pMVar24,c,local_168);
    return 0;
  }
  goto LAB_003fa1b3;
switchD_003f1334_caseD_1:
  Mat::create(c,uVar53,sVar26,iVar22,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  if ((uint)local_160 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>(a,pMVar24,c,local_168);
    return 0;
  }
  goto LAB_003fa2b9;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_avx512_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}